

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  long lVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [12];
  ulong uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar99;
  uint uVar100;
  ulong uVar101;
  undefined1 (*pauVar102) [32];
  uint uVar103;
  uint uVar104;
  int iVar105;
  ulong uVar106;
  long lVar107;
  bool bVar108;
  bool bVar109;
  byte bVar110;
  float fVar138;
  float fVar139;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar140;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar125 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar144;
  float fVar168;
  float fVar170;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  float fVar145;
  float fVar146;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar154 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar158 [16];
  undefined1 auVar167 [32];
  float fVar173;
  float fVar202;
  float fVar203;
  vint4 bi_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar204;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar183 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar205;
  float fVar224;
  float fVar225;
  vint4 ai_1;
  undefined1 auVar206 [16];
  float fVar226;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar227;
  float fVar238;
  float fVar239;
  vint4 ai_2;
  undefined1 auVar228 [16];
  float fVar240;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar234 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar241;
  float fVar255;
  float fVar256;
  undefined1 auVar242 [16];
  float fVar257;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar258;
  float fVar259;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar260;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar261;
  float fVar262;
  float fVar275;
  float fVar279;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar276;
  float fVar277;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar288;
  float fVar289;
  float fVar292;
  float fVar293;
  float fVar296;
  float fVar297;
  float fVar299;
  undefined1 auVar267 [32];
  float fVar278;
  float fVar282;
  float fVar286;
  float fVar290;
  float fVar294;
  float fVar298;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar287;
  float fVar291;
  float fVar295;
  undefined1 auVar274 [64];
  float fVar300;
  float fVar309;
  float fVar310;
  vint4 ai;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  undefined1 auVar306 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar307 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar308 [64];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar332;
  float fVar335;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float fVar333;
  float fVar334;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar360;
  float fVar361;
  undefined1 auVar355 [32];
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar356 [64];
  undefined1 auVar362 [16];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar371;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar372;
  float fVar377;
  float fVar378;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar375 [32];
  float fVar383;
  float fVar394;
  float fVar396;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  float fVar384;
  float fVar395;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_bc8;
  undefined1 local_bc0 [32];
  float local_ba0;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  Primitive *local_870;
  ulong local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  uint uStack_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar370 [64];
  undefined1 auVar376 [64];
  
  PVar10 = prim[1];
  uVar106 = (ulong)(byte)PVar10;
  lVar17 = uVar106 * 0x25;
  fVar144 = *(float *)(prim + lVar17 + 0x12);
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar151 = vsubps_avx(auVar151,*(undefined1 (*) [16])(prim + lVar17 + 6));
  auVar147._0_4_ = fVar144 * auVar151._0_4_;
  auVar147._4_4_ = fVar144 * auVar151._4_4_;
  auVar147._8_4_ = fVar144 * auVar151._8_4_;
  auVar147._12_4_ = fVar144 * auVar151._12_4_;
  auVar301._0_4_ = fVar144 * auVar18._0_4_;
  auVar301._4_4_ = fVar144 * auVar18._4_4_;
  auVar301._8_4_ = fVar144 * auVar18._8_4_;
  auVar301._12_4_ = fVar144 * auVar18._12_4_;
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar106 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar155 = vshufps_avx(auVar301,auVar301,0);
  auVar354 = vshufps_avx(auVar301,auVar301,0x55);
  auVar120 = vshufps_avx(auVar301,auVar301,0xaa);
  fVar144 = auVar120._0_4_;
  fVar146 = auVar120._4_4_;
  fVar169 = auVar120._8_4_;
  fVar171 = auVar120._12_4_;
  fVar227 = auVar354._0_4_;
  fVar238 = auVar354._4_4_;
  fVar239 = auVar354._8_4_;
  fVar240 = auVar354._12_4_;
  fVar205 = auVar155._0_4_;
  fVar224 = auVar155._4_4_;
  fVar225 = auVar155._8_4_;
  fVar226 = auVar155._12_4_;
  auVar373._0_4_ = fVar205 * auVar151._0_4_ + fVar227 * auVar18._0_4_ + fVar144 * auVar188._0_4_;
  auVar373._4_4_ = fVar224 * auVar151._4_4_ + fVar238 * auVar18._4_4_ + fVar146 * auVar188._4_4_;
  auVar373._8_4_ = fVar225 * auVar151._8_4_ + fVar239 * auVar18._8_4_ + fVar169 * auVar188._8_4_;
  auVar373._12_4_ = fVar226 * auVar151._12_4_ + fVar240 * auVar18._12_4_ + fVar171 * auVar188._12_4_
  ;
  auVar385._0_4_ = fVar205 * auVar35._0_4_ + fVar227 * auVar36._0_4_ + auVar37._0_4_ * fVar144;
  auVar385._4_4_ = fVar224 * auVar35._4_4_ + fVar238 * auVar36._4_4_ + auVar37._4_4_ * fVar146;
  auVar385._8_4_ = fVar225 * auVar35._8_4_ + fVar239 * auVar36._8_4_ + auVar37._8_4_ * fVar169;
  auVar385._12_4_ = fVar226 * auVar35._12_4_ + fVar240 * auVar36._12_4_ + auVar37._12_4_ * fVar171;
  auVar302._0_4_ = fVar205 * auVar38._0_4_ + fVar227 * auVar184._0_4_ + auVar121._0_4_ * fVar144;
  auVar302._4_4_ = fVar224 * auVar38._4_4_ + fVar238 * auVar184._4_4_ + auVar121._4_4_ * fVar146;
  auVar302._8_4_ = fVar225 * auVar38._8_4_ + fVar239 * auVar184._8_4_ + auVar121._8_4_ * fVar169;
  auVar302._12_4_ = fVar226 * auVar38._12_4_ + fVar240 * auVar184._12_4_ + auVar121._12_4_ * fVar171
  ;
  auVar155 = vshufps_avx(auVar147,auVar147,0);
  auVar354 = vshufps_avx(auVar147,auVar147,0x55);
  auVar120 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar144 = auVar120._0_4_;
  fVar146 = auVar120._4_4_;
  fVar169 = auVar120._8_4_;
  fVar171 = auVar120._12_4_;
  fVar227 = auVar354._0_4_;
  fVar238 = auVar354._4_4_;
  fVar239 = auVar354._8_4_;
  fVar240 = auVar354._12_4_;
  fVar205 = auVar155._0_4_;
  fVar224 = auVar155._4_4_;
  fVar225 = auVar155._8_4_;
  fVar226 = auVar155._12_4_;
  auVar148._0_4_ = fVar205 * auVar151._0_4_ + fVar227 * auVar18._0_4_ + fVar144 * auVar188._0_4_;
  auVar148._4_4_ = fVar224 * auVar151._4_4_ + fVar238 * auVar18._4_4_ + fVar146 * auVar188._4_4_;
  auVar148._8_4_ = fVar225 * auVar151._8_4_ + fVar239 * auVar18._8_4_ + fVar169 * auVar188._8_4_;
  auVar148._12_4_ = fVar226 * auVar151._12_4_ + fVar240 * auVar18._12_4_ + fVar171 * auVar188._12_4_
  ;
  auVar111._0_4_ = fVar205 * auVar35._0_4_ + auVar37._0_4_ * fVar144 + fVar227 * auVar36._0_4_;
  auVar111._4_4_ = fVar224 * auVar35._4_4_ + auVar37._4_4_ * fVar146 + fVar238 * auVar36._4_4_;
  auVar111._8_4_ = fVar225 * auVar35._8_4_ + auVar37._8_4_ * fVar169 + fVar239 * auVar36._8_4_;
  auVar111._12_4_ = fVar226 * auVar35._12_4_ + auVar37._12_4_ * fVar171 + fVar240 * auVar36._12_4_;
  auVar323._8_4_ = 0x7fffffff;
  auVar323._0_8_ = 0x7fffffff7fffffff;
  auVar323._12_4_ = 0x7fffffff;
  auVar151 = vandps_avx(auVar373,auVar323);
  auVar228._8_4_ = 0x219392ef;
  auVar228._0_8_ = 0x219392ef219392ef;
  auVar228._12_4_ = 0x219392ef;
  auVar151 = vcmpps_avx(auVar151,auVar228,1);
  auVar18 = vblendvps_avx(auVar373,auVar228,auVar151);
  auVar151 = vandps_avx(auVar385,auVar323);
  auVar151 = vcmpps_avx(auVar151,auVar228,1);
  auVar188 = vblendvps_avx(auVar385,auVar228,auVar151);
  auVar151 = vandps_avx(auVar323,auVar302);
  auVar151 = vcmpps_avx(auVar151,auVar228,1);
  auVar151 = vblendvps_avx(auVar302,auVar228,auVar151);
  auVar174._0_4_ = fVar205 * auVar38._0_4_ + fVar227 * auVar184._0_4_ + auVar121._0_4_ * fVar144;
  auVar174._4_4_ = fVar224 * auVar38._4_4_ + fVar238 * auVar184._4_4_ + auVar121._4_4_ * fVar146;
  auVar174._8_4_ = fVar225 * auVar38._8_4_ + fVar239 * auVar184._8_4_ + auVar121._8_4_ * fVar169;
  auVar174._12_4_ = fVar226 * auVar38._12_4_ + fVar240 * auVar184._12_4_ + auVar121._12_4_ * fVar171
  ;
  auVar35 = vrcpps_avx(auVar18);
  fVar205 = auVar35._0_4_;
  auVar206._0_4_ = fVar205 * auVar18._0_4_;
  fVar224 = auVar35._4_4_;
  auVar206._4_4_ = fVar224 * auVar18._4_4_;
  fVar225 = auVar35._8_4_;
  auVar206._8_4_ = fVar225 * auVar18._8_4_;
  fVar226 = auVar35._12_4_;
  auVar206._12_4_ = fVar226 * auVar18._12_4_;
  auVar263._8_4_ = 0x3f800000;
  auVar263._0_8_ = 0x3f8000003f800000;
  auVar263._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar263,auVar206);
  fVar205 = fVar205 + fVar205 * auVar18._0_4_;
  fVar224 = fVar224 + fVar224 * auVar18._4_4_;
  fVar225 = fVar225 + fVar225 * auVar18._8_4_;
  fVar226 = fVar226 + fVar226 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar188);
  fVar227 = auVar18._0_4_;
  auVar242._0_4_ = fVar227 * auVar188._0_4_;
  fVar238 = auVar18._4_4_;
  auVar242._4_4_ = fVar238 * auVar188._4_4_;
  fVar239 = auVar18._8_4_;
  auVar242._8_4_ = fVar239 * auVar188._8_4_;
  fVar240 = auVar18._12_4_;
  auVar242._12_4_ = fVar240 * auVar188._12_4_;
  auVar18 = vsubps_avx(auVar263,auVar242);
  fVar227 = fVar227 + fVar227 * auVar18._0_4_;
  fVar238 = fVar238 + fVar238 * auVar18._4_4_;
  fVar239 = fVar239 + fVar239 * auVar18._8_4_;
  fVar240 = fVar240 + fVar240 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar151);
  fVar241 = auVar18._0_4_;
  auVar303._0_4_ = fVar241 * auVar151._0_4_;
  fVar255 = auVar18._4_4_;
  auVar303._4_4_ = fVar255 * auVar151._4_4_;
  fVar256 = auVar18._8_4_;
  auVar303._8_4_ = fVar256 * auVar151._8_4_;
  fVar257 = auVar18._12_4_;
  auVar303._12_4_ = fVar257 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar263,auVar303);
  fVar241 = fVar241 + fVar241 * auVar151._0_4_;
  fVar255 = fVar255 + fVar255 * auVar151._4_4_;
  fVar256 = fVar256 + fVar256 * auVar151._8_4_;
  fVar257 = fVar257 + fVar257 * auVar151._12_4_;
  auVar151 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar17 + 0x16)) *
                           *(float *)(prim + lVar17 + 0x1a)));
  auVar188 = vshufps_avx(auVar151,auVar151,0);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar151 = vpmovsxwd_avx(auVar151);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar35 = vsubps_avx(auVar18,auVar151);
  fVar144 = auVar188._0_4_;
  fVar146 = auVar188._4_4_;
  fVar169 = auVar188._8_4_;
  fVar171 = auVar188._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar18 = vpmovsxwd_avx(auVar188);
  auVar304._0_4_ = auVar35._0_4_ * fVar144 + auVar151._0_4_;
  auVar304._4_4_ = auVar35._4_4_ * fVar146 + auVar151._4_4_;
  auVar304._8_4_ = auVar35._8_4_ * fVar169 + auVar151._8_4_;
  auVar304._12_4_ = auVar35._12_4_ * fVar171 + auVar151._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 6);
  auVar188 = vpmovsxwd_avx(auVar35);
  auVar151 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar188);
  auVar18 = vsubps_avx(auVar18,auVar151);
  auVar324._0_4_ = auVar18._0_4_ * fVar144 + auVar151._0_4_;
  auVar324._4_4_ = auVar18._4_4_ * fVar146 + auVar151._4_4_;
  auVar324._8_4_ = auVar18._8_4_ * fVar169 + auVar151._8_4_;
  auVar324._12_4_ = auVar18._12_4_ * fVar171 + auVar151._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 6);
  auVar151 = vpmovsxwd_avx(auVar36);
  uVar101 = (ulong)(uint)((int)(uVar106 * 5) << 2);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar106 * 2 + uVar101 + 6);
  auVar18 = vpmovsxwd_avx(auVar37);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar151);
  auVar353._0_4_ = auVar18._0_4_ * fVar144 + auVar151._0_4_;
  auVar353._4_4_ = auVar18._4_4_ * fVar146 + auVar151._4_4_;
  auVar353._8_4_ = auVar18._8_4_ * fVar169 + auVar151._8_4_;
  auVar353._12_4_ = auVar18._12_4_ * fVar171 + auVar151._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar151 = vpmovsxwd_avx(auVar38);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 6);
  auVar18 = vpmovsxwd_avx(auVar184);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar188 = vsubps_avx(auVar18,auVar151);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 6);
  auVar18 = vpmovsxwd_avx(auVar121);
  auVar362._0_4_ = auVar188._0_4_ * fVar144 + auVar151._0_4_;
  auVar362._4_4_ = auVar188._4_4_ * fVar146 + auVar151._4_4_;
  auVar362._8_4_ = auVar188._8_4_ * fVar169 + auVar151._8_4_;
  auVar362._12_4_ = auVar188._12_4_ * fVar171 + auVar151._12_4_;
  auVar151 = vcvtdq2ps_avx(auVar18);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar106 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar18 = vpmovsxwd_avx(auVar155);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar151);
  auVar366._0_4_ = auVar18._0_4_ * fVar144 + auVar151._0_4_;
  auVar366._4_4_ = auVar18._4_4_ * fVar146 + auVar151._4_4_;
  auVar366._8_4_ = auVar18._8_4_ * fVar169 + auVar151._8_4_;
  auVar366._12_4_ = auVar18._12_4_ * fVar171 + auVar151._12_4_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar106) + 6);
  auVar151 = vpmovsxwd_avx(auVar354);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 6);
  auVar18 = vpmovsxwd_avx(auVar120);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar151);
  auVar264._0_4_ = auVar151._0_4_ + auVar18._0_4_ * fVar144;
  auVar264._4_4_ = auVar151._4_4_ + auVar18._4_4_ * fVar146;
  auVar264._8_4_ = auVar151._8_4_ + auVar18._8_4_ * fVar169;
  auVar264._12_4_ = auVar151._12_4_ + auVar18._12_4_ * fVar171;
  auVar151 = vsubps_avx(auVar304,auVar148);
  auVar305._0_4_ = fVar205 * auVar151._0_4_;
  auVar305._4_4_ = fVar224 * auVar151._4_4_;
  auVar305._8_4_ = fVar225 * auVar151._8_4_;
  auVar305._12_4_ = fVar226 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar324,auVar148);
  auVar149._0_4_ = fVar205 * auVar151._0_4_;
  auVar149._4_4_ = fVar224 * auVar151._4_4_;
  auVar149._8_4_ = fVar225 * auVar151._8_4_;
  auVar149._12_4_ = fVar226 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar353,auVar111);
  auVar207._0_4_ = fVar227 * auVar151._0_4_;
  auVar207._4_4_ = fVar238 * auVar151._4_4_;
  auVar207._8_4_ = fVar239 * auVar151._8_4_;
  auVar207._12_4_ = fVar240 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar362,auVar111);
  auVar112._0_4_ = fVar227 * auVar151._0_4_;
  auVar112._4_4_ = fVar238 * auVar151._4_4_;
  auVar112._8_4_ = fVar239 * auVar151._8_4_;
  auVar112._12_4_ = fVar240 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar366,auVar174);
  auVar229._0_4_ = fVar241 * auVar151._0_4_;
  auVar229._4_4_ = fVar255 * auVar151._4_4_;
  auVar229._8_4_ = fVar256 * auVar151._8_4_;
  auVar229._12_4_ = fVar257 * auVar151._12_4_;
  auVar151 = vsubps_avx(auVar264,auVar174);
  auVar175._0_4_ = fVar241 * auVar151._0_4_;
  auVar175._4_4_ = fVar255 * auVar151._4_4_;
  auVar175._8_4_ = fVar256 * auVar151._8_4_;
  auVar175._12_4_ = fVar257 * auVar151._12_4_;
  auVar151 = vpminsd_avx(auVar305,auVar149);
  auVar18 = vpminsd_avx(auVar207,auVar112);
  auVar151 = vmaxps_avx(auVar151,auVar18);
  auVar18 = vpminsd_avx(auVar229,auVar175);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar325._4_4_ = uVar8;
  auVar325._0_4_ = uVar8;
  auVar325._8_4_ = uVar8;
  auVar325._12_4_ = uVar8;
  auVar18 = vmaxps_avx(auVar18,auVar325);
  auVar151 = vmaxps_avx(auVar151,auVar18);
  local_5a0._0_4_ = auVar151._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar151._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar151._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar151._12_4_ * 0.99999964;
  auVar151 = vpmaxsd_avx(auVar305,auVar149);
  auVar18 = vpmaxsd_avx(auVar207,auVar112);
  auVar151 = vminps_avx(auVar151,auVar18);
  auVar18 = vpmaxsd_avx(auVar229,auVar175);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar176._4_4_ = uVar8;
  auVar176._0_4_ = uVar8;
  auVar176._8_4_ = uVar8;
  auVar176._12_4_ = uVar8;
  auVar18 = vminps_avx(auVar18,auVar176);
  auVar151 = vminps_avx(auVar151,auVar18);
  auVar113._0_4_ = auVar151._0_4_ * 1.0000004;
  auVar113._4_4_ = auVar151._4_4_ * 1.0000004;
  auVar113._8_4_ = auVar151._8_4_ * 1.0000004;
  auVar113._12_4_ = auVar151._12_4_ * 1.0000004;
  auVar151 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar18 = vpcmpgtd_avx(auVar151,_DAT_01f7fcf0);
  auVar151 = vcmpps_avx(local_5a0,auVar113,2);
  auVar151 = vandps_avx(auVar151,auVar18);
  uVar99 = vmovmskps_avx(auVar151);
  if (uVar99 == 0) {
    return false;
  }
  uVar99 = uVar99 & 0xff;
  auVar127._16_16_ = mm_lookupmask_ps._240_16_;
  auVar127._0_16_ = mm_lookupmask_ps._240_16_;
  local_500 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,0x80);
  local_870 = prim;
LAB_00f38277:
  local_868 = (ulong)uVar99;
  lVar17 = 0;
  if (local_868 != 0) {
    for (; (uVar99 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  uVar99 = *(uint *)(local_870 + 2);
  pGVar11 = (context->scene->geometries).items[uVar99].ptr;
  uVar106 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                            (ulong)*(uint *)(local_870 + lVar17 * 4 + 6) *
                            pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar144 = (pGVar11->time_range).lower;
  fVar144 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar144) / ((pGVar11->time_range).upper - fVar144));
  auVar151 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
  auVar151 = vminss_avx(auVar151,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar151 = vmaxss_avx(ZEXT816(0) << 0x20,auVar151);
  fVar144 = fVar144 - auVar151._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar107 = (long)(int)auVar151._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + 0x10 + lVar107);
  lVar14 = *(long *)(_Var12 + 0x38 + lVar107);
  lVar15 = *(long *)(_Var12 + 0x48 + lVar107);
  auVar151 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
  pfVar1 = (float *)(lVar14 + uVar106 * lVar15);
  fVar224 = auVar151._0_4_;
  fVar225 = auVar151._4_4_;
  fVar226 = auVar151._8_4_;
  fVar227 = auVar151._12_4_;
  pfVar2 = (float *)(lVar14 + (uVar106 + 1) * lVar15);
  pfVar3 = (float *)(lVar14 + (uVar106 + 2) * lVar15);
  pfVar4 = (float *)(lVar14 + lVar15 * (uVar106 + 3));
  lVar14 = *(long *)(_Var12 + lVar107);
  auVar151 = vshufps_avx(ZEXT416((uint)(1.0 - fVar144)),ZEXT416((uint)(1.0 - fVar144)),0);
  pfVar5 = (float *)(lVar14 + lVar13 * uVar106);
  fVar146 = auVar151._0_4_;
  fVar169 = auVar151._4_4_;
  fVar171 = auVar151._8_4_;
  fVar205 = auVar151._12_4_;
  pfVar6 = (float *)(lVar14 + lVar13 * (uVar106 + 1));
  pfVar7 = (float *)(lVar14 + lVar13 * (uVar106 + 2));
  auVar177._0_4_ = fVar224 * *pfVar1 + fVar146 * *pfVar5;
  auVar177._4_4_ = fVar225 * pfVar1[1] + fVar169 * pfVar5[1];
  auVar177._8_4_ = fVar226 * pfVar1[2] + fVar171 * pfVar5[2];
  auVar177._12_4_ = fVar227 * pfVar1[3] + fVar205 * pfVar5[3];
  auVar150._0_4_ = fVar146 * *pfVar6 + fVar224 * *pfVar2;
  auVar150._4_4_ = fVar169 * pfVar6[1] + fVar225 * pfVar2[1];
  auVar150._8_4_ = fVar171 * pfVar6[2] + fVar226 * pfVar2[2];
  auVar150._12_4_ = fVar205 * pfVar6[3] + fVar227 * pfVar2[3];
  pfVar1 = (float *)(lVar14 + lVar13 * (uVar106 + 3));
  auVar208._0_4_ = fVar146 * *pfVar7 + fVar224 * *pfVar3;
  auVar208._4_4_ = fVar169 * pfVar7[1] + fVar225 * pfVar3[1];
  auVar208._8_4_ = fVar171 * pfVar7[2] + fVar226 * pfVar3[2];
  auVar208._12_4_ = fVar205 * pfVar7[3] + fVar227 * pfVar3[3];
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar18 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar144 = *(float *)(ray + k * 4 + 0x40);
  auVar367._4_4_ = fVar144;
  auVar367._0_4_ = fVar144;
  auVar367._8_4_ = fVar144;
  auVar367._12_4_ = fVar144;
  fStack_a10 = fVar144;
  _local_a20 = auVar367;
  fStack_a0c = fVar144;
  fStack_a08 = fVar144;
  fStack_a04 = fVar144;
  auVar370 = ZEXT3264(_local_a20);
  auVar243._0_4_ = fVar146 * *pfVar1 + fVar224 * *pfVar4;
  auVar243._4_4_ = fVar169 * pfVar1[1] + fVar225 * pfVar4[1];
  auVar243._8_4_ = fVar171 * pfVar1[2] + fVar226 * pfVar4[2];
  auVar243._12_4_ = fVar205 * pfVar1[3] + fVar227 * pfVar4[3];
  fVar146 = *(float *)(ray + k * 4 + 0x50);
  auVar374._4_4_ = fVar146;
  auVar374._0_4_ = fVar146;
  auVar374._8_4_ = fVar146;
  auVar374._12_4_ = fVar146;
  fStack_970 = fVar146;
  _local_980 = auVar374;
  fStack_96c = fVar146;
  fStack_968 = fVar146;
  fStack_964 = fVar146;
  auVar376 = ZEXT3264(_local_980);
  auVar151 = vunpcklps_avx(auVar367,auVar374);
  fVar169 = *(float *)(ray + k * 4 + 0x60);
  auVar386._4_4_ = fVar169;
  auVar386._0_4_ = fVar169;
  auVar386._8_4_ = fVar169;
  auVar386._12_4_ = fVar169;
  fStack_7f0 = fVar169;
  _local_800 = auVar386;
  fStack_7ec = fVar169;
  fStack_7e8 = fVar169;
  fStack_7e4 = fVar169;
  _local_9b0 = vinsertps_avx(auVar151,auVar386,0x28);
  auVar356 = ZEXT1664(_local_9b0);
  auVar114._0_4_ = (auVar177._0_4_ + auVar150._0_4_ + auVar208._0_4_ + auVar243._0_4_) * 0.25;
  auVar114._4_4_ = (auVar177._4_4_ + auVar150._4_4_ + auVar208._4_4_ + auVar243._4_4_) * 0.25;
  auVar114._8_4_ = (auVar177._8_4_ + auVar150._8_4_ + auVar208._8_4_ + auVar243._8_4_) * 0.25;
  auVar114._12_4_ = (auVar177._12_4_ + auVar150._12_4_ + auVar208._12_4_ + auVar243._12_4_) * 0.25;
  auVar151 = vsubps_avx(auVar114,auVar18);
  auVar151 = vdpps_avx(auVar151,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar365 = ZEXT1664(local_9c0);
  auVar188 = vrcpss_avx(local_9c0,local_9c0);
  fVar171 = auVar151._0_4_ * auVar188._0_4_ * (2.0 - local_9c0._0_4_ * auVar188._0_4_);
  auVar308 = ZEXT464((uint)fVar171);
  auVar188 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
  auVar230._0_4_ = auVar18._0_4_ + local_9b0._0_4_ * auVar188._0_4_;
  auVar230._4_4_ = auVar18._4_4_ + local_9b0._4_4_ * auVar188._4_4_;
  auVar230._8_4_ = auVar18._8_4_ + local_9b0._8_4_ * auVar188._8_4_;
  auVar230._12_4_ = auVar18._12_4_ + local_9b0._12_4_ * auVar188._12_4_;
  auVar151 = vblendps_avx(auVar230,_DAT_01f7aa10,8);
  auVar35 = vsubps_avx(auVar177,auVar151);
  auVar274 = ZEXT1664(auVar35);
  auVar36 = vsubps_avx(auVar208,auVar151);
  auVar37 = vsubps_avx(auVar150,auVar151);
  auVar38 = vsubps_avx(auVar243,auVar151);
  auVar151 = vshufps_avx(auVar35,auVar35,0);
  register0x00001250 = auVar151;
  _local_1e0 = auVar151;
  auVar151 = vshufps_avx(auVar35,auVar35,0x55);
  register0x00001250 = auVar151;
  _local_200 = auVar151;
  auVar151 = vshufps_avx(auVar35,auVar35,0xaa);
  register0x00001250 = auVar151;
  _local_220 = auVar151;
  auVar151 = vshufps_avx(auVar35,auVar35,0xff);
  register0x00001290 = auVar151;
  _local_240 = auVar151;
  auVar151 = vshufps_avx(auVar37,auVar37,0);
  register0x00001290 = auVar151;
  _local_260 = auVar151;
  auVar151 = vshufps_avx(auVar37,auVar37,0x55);
  register0x00001290 = auVar151;
  _local_280 = auVar151;
  auVar151 = vshufps_avx(auVar37,auVar37,0xaa);
  register0x00001290 = auVar151;
  _local_3e0 = auVar151;
  auVar151 = vshufps_avx(auVar37,auVar37,0xff);
  register0x00001290 = auVar151;
  _local_2a0 = auVar151;
  auVar151 = vshufps_avx(auVar36,auVar36,0);
  register0x00001290 = auVar151;
  _local_400 = auVar151;
  auVar151 = vshufps_avx(auVar36,auVar36,0x55);
  register0x00001290 = auVar151;
  _local_420 = auVar151;
  auVar151 = vshufps_avx(auVar36,auVar36,0xaa);
  register0x00001290 = auVar151;
  _local_440 = auVar151;
  auVar151 = vshufps_avx(auVar36,auVar36,0xff);
  register0x00001290 = auVar151;
  _local_460 = auVar151;
  auVar151 = vshufps_avx(auVar38,auVar38,0);
  register0x00001290 = auVar151;
  _local_480 = auVar151;
  auVar151 = vshufps_avx(auVar38,auVar38,0x55);
  register0x00001290 = auVar151;
  _local_4a0 = auVar151;
  auVar151 = vshufps_avx(auVar38,auVar38,0xaa);
  register0x00001290 = auVar151;
  _local_4c0 = auVar151;
  auVar151 = vshufps_avx(auVar38,auVar38,0xff);
  local_4e0._16_16_ = auVar151;
  local_4e0._0_16_ = auVar151;
  auVar151 = ZEXT416((uint)(fVar144 * fVar144 + fVar146 * fVar146 + fVar169 * fVar169));
  auVar151 = vshufps_avx(auVar151,auVar151,0);
  local_2c0._16_16_ = auVar151;
  local_2c0._0_16_ = auVar151;
  fVar144 = *(float *)(ray + k * 4 + 0x30);
  local_890 = ZEXT416((uint)fVar171);
  auVar151 = vshufps_avx(ZEXT416((uint)(fVar144 - fVar171)),ZEXT416((uint)(fVar144 - fVar171)),0);
  local_2e0._16_16_ = auVar151;
  local_2e0._0_16_ = auVar151;
  local_790 = vpshufd_avx(ZEXT416(uVar99),0);
  local_7a0 = vpshufd_avx(ZEXT416(*(uint *)(local_870 + lVar17 * 4 + 6)),0);
  register0x00001210 = auVar188;
  _local_8e0 = auVar188;
  uVar106 = 0;
  bVar108 = false;
  local_bc8 = 1;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(local_2c0,auVar128);
  auVar151 = vsqrtss_avx(local_9c0,local_9c0);
  auVar18 = vsqrtss_avx(local_9c0,local_9c0);
  local_590 = ZEXT816(0x3f80000000000000);
  do {
    auVar248._8_4_ = 0x3f800000;
    auVar248._0_8_ = 0x3f8000003f800000;
    auVar248._12_4_ = 0x3f800000;
    auVar248._16_4_ = 0x3f800000;
    auVar248._20_4_ = 0x3f800000;
    auVar248._24_4_ = 0x3f800000;
    auVar248._28_4_ = 0x3f800000;
    iVar105 = (int)uVar106;
    auVar188 = vmovshdup_avx(local_590);
    auVar121 = vsubps_avx(auVar188,local_590);
    auVar188 = vshufps_avx(local_590,local_590,0);
    auVar184 = vshufps_avx(auVar121,auVar121,0);
    fVar145 = auVar184._0_4_;
    fVar168 = auVar184._4_4_;
    fVar170 = auVar184._8_4_;
    fVar172 = auVar184._12_4_;
    fVar173 = auVar188._0_4_;
    auVar220._0_4_ = fVar173 + fVar145 * 0.0;
    fVar202 = auVar188._4_4_;
    auVar220._4_4_ = fVar202 + fVar168 * 0.14285715;
    fVar203 = auVar188._8_4_;
    auVar220._8_4_ = fVar203 + fVar170 * 0.2857143;
    fVar204 = auVar188._12_4_;
    auVar220._12_4_ = fVar204 + fVar172 * 0.42857146;
    auVar220._16_4_ = fVar173 + fVar145 * 0.5714286;
    auVar220._20_4_ = fVar202 + fVar168 * 0.71428573;
    auVar220._24_4_ = fVar203 + fVar170 * 0.8571429;
    auVar220._28_4_ = fVar204 + fVar172;
    auVar127 = vsubps_avx(auVar248,auVar220);
    fVar146 = auVar127._0_4_;
    fVar169 = auVar127._4_4_;
    fVar171 = auVar127._8_4_;
    fVar205 = auVar127._12_4_;
    fVar224 = auVar127._16_4_;
    fVar225 = auVar127._20_4_;
    fVar226 = auVar127._24_4_;
    fVar239 = fVar146 * fVar146 * fVar146;
    fVar275 = fVar169 * fVar169 * fVar169;
    fVar279 = fVar171 * fVar171 * fVar171;
    fVar283 = fVar205 * fVar205 * fVar205;
    fVar287 = fVar224 * fVar224 * fVar224;
    fVar291 = fVar225 * fVar225 * fVar225;
    fVar295 = fVar226 * fVar226 * fVar226;
    fVar300 = auVar220._0_4_ * auVar220._0_4_ * auVar220._0_4_;
    fVar309 = auVar220._4_4_ * auVar220._4_4_ * auVar220._4_4_;
    fVar310 = auVar220._8_4_ * auVar220._8_4_ * auVar220._8_4_;
    fVar312 = auVar220._12_4_ * auVar220._12_4_ * auVar220._12_4_;
    fVar314 = auVar220._16_4_ * auVar220._16_4_ * auVar220._16_4_;
    fVar316 = auVar220._20_4_ * auVar220._20_4_ * auVar220._20_4_;
    fVar318 = auVar220._24_4_ * auVar220._24_4_ * auVar220._24_4_;
    fVar227 = auVar220._0_4_ * fVar146;
    fVar238 = auVar220._4_4_ * fVar169;
    fVar240 = auVar220._8_4_ * fVar171;
    fVar255 = auVar220._12_4_ * fVar205;
    fVar256 = auVar220._16_4_ * fVar224;
    fVar257 = auVar220._20_4_ * fVar225;
    fVar259 = auVar220._24_4_ * fVar226;
    fVar241 = auVar365._28_4_ + auVar376._28_4_;
    fVar350 = auVar308._28_4_ + 1.0 + fVar241;
    fVar360 = fVar241 + auVar274._28_4_ + auVar370._28_4_ + auVar356._28_4_;
    fVar241 = fVar239 * 0.16666667;
    fVar276 = fVar275 * 0.16666667;
    fVar280 = fVar279 * 0.16666667;
    fVar284 = fVar283 * 0.16666667;
    fVar288 = fVar287 * 0.16666667;
    fVar292 = fVar291 * 0.16666667;
    fVar296 = fVar295 * 0.16666667;
    fVar320 = (fVar300 + fVar239 * 4.0 + fVar146 * fVar227 * 12.0 + auVar220._0_4_ * fVar227 * 6.0)
              * 0.16666667;
    fVar332 = (fVar309 + fVar275 * 4.0 + fVar169 * fVar238 * 12.0 + auVar220._4_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar335 = (fVar310 + fVar279 * 4.0 + fVar171 * fVar240 * 12.0 + auVar220._8_4_ * fVar240 * 6.0)
              * 0.16666667;
    fVar338 = (fVar312 + fVar283 * 4.0 + fVar205 * fVar255 * 12.0 + auVar220._12_4_ * fVar255 * 6.0)
              * 0.16666667;
    fVar341 = (fVar314 + fVar287 * 4.0 + fVar224 * fVar256 * 12.0 + auVar220._16_4_ * fVar256 * 6.0)
              * 0.16666667;
    fVar344 = (fVar316 + fVar291 * 4.0 + fVar225 * fVar257 * 12.0 + auVar220._20_4_ * fVar257 * 6.0)
              * 0.16666667;
    fVar347 = (fVar318 + fVar295 * 4.0 + fVar226 * fVar259 * 12.0 + auVar220._24_4_ * fVar259 * 6.0)
              * 0.16666667;
    fVar239 = (fVar300 * 4.0 + fVar239 + auVar220._0_4_ * fVar227 * 12.0 + fVar146 * fVar227 * 6.0)
              * 0.16666667;
    fVar275 = (fVar309 * 4.0 + fVar275 + auVar220._4_4_ * fVar238 * 12.0 + fVar169 * fVar238 * 6.0)
              * 0.16666667;
    fVar279 = (fVar310 * 4.0 + fVar279 + auVar220._8_4_ * fVar240 * 12.0 + fVar171 * fVar240 * 6.0)
              * 0.16666667;
    fVar283 = (fVar312 * 4.0 + fVar283 + auVar220._12_4_ * fVar255 * 12.0 + fVar205 * fVar255 * 6.0)
              * 0.16666667;
    fVar287 = (fVar314 * 4.0 + fVar287 + auVar220._16_4_ * fVar256 * 12.0 + fVar224 * fVar256 * 6.0)
              * 0.16666667;
    fVar291 = (fVar316 * 4.0 + fVar291 + auVar220._20_4_ * fVar257 * 12.0 + fVar225 * fVar257 * 6.0)
              * 0.16666667;
    fVar295 = (fVar318 * 4.0 + fVar295 + auVar220._24_4_ * fVar259 * 12.0 + fVar226 * fVar259 * 6.0)
              * 0.16666667;
    fVar300 = fVar300 * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar310 = fVar310 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar318 = fVar318 * 0.16666667;
    fVar371 = auVar370._28_4_ + 12.0;
    fVar361 = fVar360 + 12.166667;
    fVar321 = (float)local_1e0._0_4_ * fVar241 +
              (float)local_260._0_4_ * fVar320 +
              fVar300 * (float)local_480._0_4_ + fVar239 * (float)local_400._0_4_;
    fVar333 = (float)local_1e0._4_4_ * fVar276 +
              (float)local_260._4_4_ * fVar332 +
              fVar309 * (float)local_480._4_4_ + fVar275 * (float)local_400._4_4_;
    fVar336 = fStack_1d8 * fVar280 +
              fStack_258 * fVar335 + fVar310 * fStack_478 + fVar279 * fStack_3f8;
    fVar339 = fStack_1d4 * fVar284 +
              fStack_254 * fVar338 + fVar312 * fStack_474 + fVar283 * fStack_3f4;
    fVar342 = fStack_1d0 * fVar288 +
              fStack_250 * fVar341 + fVar314 * fStack_470 + fVar287 * fStack_3f0;
    fVar345 = fStack_1cc * fVar292 +
              fStack_24c * fVar344 + fVar316 * fStack_46c + fVar291 * fStack_3ec;
    fVar348 = fStack_1c8 * fVar296 +
              fStack_248 * fVar347 + fVar318 * fStack_468 + fVar295 * fStack_3e8;
    fVar351 = fVar350 + fVar361;
    fVar322 = (float)local_200._0_4_ * fVar241 +
              (float)local_280._0_4_ * fVar320 +
              fVar300 * (float)local_4a0._0_4_ + fVar239 * (float)local_420._0_4_;
    fVar334 = (float)local_200._4_4_ * fVar276 +
              (float)local_280._4_4_ * fVar332 +
              fVar309 * (float)local_4a0._4_4_ + fVar275 * (float)local_420._4_4_;
    fVar337 = fStack_1f8 * fVar280 +
              fStack_278 * fVar335 + fVar310 * fStack_498 + fVar279 * fStack_418;
    fVar340 = fStack_1f4 * fVar284 +
              fStack_274 * fVar338 + fVar312 * fStack_494 + fVar283 * fStack_414;
    fVar343 = fStack_1f0 * fVar288 +
              fStack_270 * fVar341 + fVar314 * fStack_490 + fVar287 * fStack_410;
    fVar346 = fStack_1ec * fVar292 +
              fStack_26c * fVar344 + fVar316 * fStack_48c + fVar291 * fStack_40c;
    fVar349 = fStack_1e8 * fVar296 +
              fStack_268 * fVar347 + fVar318 * fStack_488 + fVar295 * fStack_408;
    fVar352 = fVar351 + fVar371 + 12.166667;
    local_920 = (float)local_220._0_4_ * fVar241 +
                fVar320 * (float)local_3e0._0_4_ +
                fVar300 * (float)local_4c0._0_4_ + fVar239 * (float)local_440._0_4_;
    fStack_91c = (float)local_220._4_4_ * fVar276 +
                 fVar332 * (float)local_3e0._4_4_ +
                 fVar309 * (float)local_4c0._4_4_ + fVar275 * (float)local_440._4_4_;
    fStack_918 = fStack_218 * fVar280 +
                 fVar335 * fStack_3d8 + fVar310 * fStack_4b8 + fVar279 * fStack_438;
    fStack_914 = fStack_214 * fVar284 +
                 fVar338 * fStack_3d4 + fVar312 * fStack_4b4 + fVar283 * fStack_434;
    fStack_910 = fStack_210 * fVar288 +
                 fVar341 * fStack_3d0 + fVar314 * fStack_4b0 + fVar287 * fStack_430;
    fStack_90c = fStack_20c * fVar292 +
                 fVar344 * fStack_3cc + fVar316 * fStack_4ac + fVar291 * fStack_42c;
    fStack_908 = fStack_208 * fVar296 +
                 fVar347 * fStack_3c8 + fVar318 * fStack_4a8 + fVar295 * fStack_428;
    fStack_904 = fVar352 + fVar371 + auVar376._28_4_ + 12.0;
    local_a80._0_4_ =
         (float)local_240._0_4_ * fVar241 +
         (float)local_2a0._0_4_ * fVar320 +
         fVar239 * (float)local_460._0_4_ + local_4e0._0_4_ * fVar300;
    local_a80._4_4_ =
         (float)local_240._4_4_ * fVar276 +
         (float)local_2a0._4_4_ * fVar332 +
         fVar275 * (float)local_460._4_4_ + local_4e0._4_4_ * fVar309;
    fStack_a78 = fStack_238 * fVar280 +
                 fStack_298 * fVar335 + fVar279 * fStack_458 + local_4e0._8_4_ * fVar310;
    fStack_a74 = fStack_234 * fVar284 +
                 fStack_294 * fVar338 + fVar283 * fStack_454 + local_4e0._12_4_ * fVar312;
    fStack_a70 = fStack_230 * fVar288 +
                 fStack_290 * fVar341 + fVar287 * fStack_450 + local_4e0._16_4_ * fVar314;
    fStack_a6c = fStack_22c * fVar292 +
                 fStack_28c * fVar344 + fVar291 * fStack_44c + local_4e0._20_4_ * fVar316;
    fStack_a68 = fStack_228 * fVar296 +
                 fStack_288 * fVar347 + fVar295 * fStack_448 + local_4e0._24_4_ * fVar318;
    fStack_a64 = auVar274._28_4_ + fVar350 + fVar360 + auVar308._28_4_;
    auVar42._4_4_ = auVar220._4_4_ * -auVar220._4_4_;
    auVar42._0_4_ = auVar220._0_4_ * -auVar220._0_4_;
    auVar42._8_4_ = auVar220._8_4_ * -auVar220._8_4_;
    auVar42._12_4_ = auVar220._12_4_ * -auVar220._12_4_;
    auVar42._16_4_ = auVar220._16_4_ * -auVar220._16_4_;
    auVar42._20_4_ = auVar220._20_4_ * -auVar220._20_4_;
    auVar42._24_4_ = auVar220._24_4_ * -auVar220._24_4_;
    auVar42._28_4_ = auVar220._28_4_;
    auVar39._4_4_ = fVar238 * 4.0;
    auVar39._0_4_ = fVar227 * 4.0;
    auVar39._8_4_ = fVar240 * 4.0;
    auVar39._12_4_ = fVar255 * 4.0;
    auVar39._16_4_ = fVar256 * 4.0;
    auVar39._20_4_ = fVar257 * 4.0;
    auVar39._24_4_ = fVar259 * 4.0;
    auVar39._28_4_ = 0x3f800000;
    auVar127 = vsubps_avx(auVar42,auVar39);
    fVar292 = fVar146 * -fVar146 * 0.5;
    fVar295 = fVar169 * -fVar169 * 0.5;
    fVar296 = fVar171 * -fVar171 * 0.5;
    fVar300 = fVar205 * -fVar205 * 0.5;
    fVar309 = fVar224 * -fVar224 * 0.5;
    fVar310 = fVar225 * -fVar225 * 0.5;
    fVar312 = fVar226 * -fVar226 * 0.5;
    fVar275 = auVar127._0_4_ * 0.5;
    fVar279 = auVar127._4_4_ * 0.5;
    fVar283 = auVar127._8_4_ * 0.5;
    fVar284 = auVar127._12_4_ * 0.5;
    fVar287 = auVar127._16_4_ * 0.5;
    fVar288 = auVar127._20_4_ * 0.5;
    fVar291 = auVar127._24_4_ * 0.5;
    fVar227 = (fVar146 * fVar146 + fVar227 * 4.0) * 0.5;
    fVar239 = (fVar169 * fVar169 + fVar238 * 4.0) * 0.5;
    fVar241 = (fVar171 * fVar171 + fVar240 * 4.0) * 0.5;
    fVar255 = (fVar205 * fVar205 + fVar255 * 4.0) * 0.5;
    fVar256 = (fVar224 * fVar224 + fVar256 * 4.0) * 0.5;
    fVar257 = (fVar225 * fVar225 + fVar257 * 4.0) * 0.5;
    fVar280 = (fVar226 * fVar226 + fVar259 * 4.0) * 0.5;
    fVar146 = auVar220._0_4_ * auVar220._0_4_ * 0.5;
    fVar169 = auVar220._4_4_ * auVar220._4_4_ * 0.5;
    fVar171 = auVar220._8_4_ * auVar220._8_4_ * 0.5;
    fVar205 = auVar220._12_4_ * auVar220._12_4_ * 0.5;
    fVar224 = auVar220._16_4_ * auVar220._16_4_ * 0.5;
    fVar225 = auVar220._20_4_ * auVar220._20_4_ * 0.5;
    fVar240 = auVar220._24_4_ * auVar220._24_4_ * 0.5;
    fVar299 = fVar352 + fVar361 + fVar361 + 4.0;
    auVar188 = vpermilps_avx(ZEXT416((uint)(auVar121._0_4_ * 0.04761905)),0);
    fVar226 = auVar188._0_4_;
    fVar261 = fVar226 * ((float)local_1e0._0_4_ * fVar292 +
                        (float)local_260._0_4_ * fVar275 +
                        fVar227 * (float)local_400._0_4_ + fVar146 * (float)local_480._0_4_);
    fVar238 = auVar188._4_4_;
    fVar277 = fVar238 * ((float)local_1e0._4_4_ * fVar295 +
                        (float)local_260._4_4_ * fVar279 +
                        fVar239 * (float)local_400._4_4_ + fVar169 * (float)local_480._4_4_);
    auVar50._4_4_ = fVar277;
    auVar50._0_4_ = fVar261;
    fVar259 = auVar188._8_4_;
    fVar281 = fVar259 * (fStack_1d8 * fVar296 +
                        fStack_258 * fVar283 + fVar241 * fStack_3f8 + fVar171 * fStack_478);
    auVar50._8_4_ = fVar281;
    fVar276 = auVar188._12_4_;
    fVar285 = fVar276 * (fStack_1d4 * fVar300 +
                        fStack_254 * fVar284 + fVar255 * fStack_3f4 + fVar205 * fStack_474);
    auVar50._12_4_ = fVar285;
    fVar289 = fVar226 * (fStack_1d0 * fVar309 +
                        fStack_250 * fVar287 + fVar256 * fStack_3f0 + fVar224 * fStack_470);
    auVar50._16_4_ = fVar289;
    fVar293 = fVar238 * (fStack_1cc * fVar310 +
                        fStack_24c * fVar288 + fVar257 * fStack_3ec + fVar225 * fStack_46c);
    auVar50._20_4_ = fVar293;
    fVar297 = fVar259 * (fStack_1c8 * fVar312 +
                        fStack_248 * fVar291 + fVar280 * fStack_3e8 + fVar240 * fStack_468);
    auVar50._24_4_ = fVar297;
    auVar50._28_4_ = fVar299;
    fVar372 = fVar226 * ((float)local_200._0_4_ * fVar292 +
                        (float)local_280._0_4_ * fVar275 +
                        fVar227 * (float)local_420._0_4_ + fVar146 * (float)local_4a0._0_4_);
    fVar377 = fVar238 * ((float)local_200._4_4_ * fVar295 +
                        (float)local_280._4_4_ * fVar279 +
                        fVar239 * (float)local_420._4_4_ + fVar169 * (float)local_4a0._4_4_);
    auVar46._4_4_ = fVar377;
    auVar46._0_4_ = fVar372;
    fVar378 = fVar259 * (fStack_1f8 * fVar296 +
                        fStack_278 * fVar283 + fVar241 * fStack_418 + fVar171 * fStack_498);
    auVar46._8_4_ = fVar378;
    fVar379 = fVar276 * (fStack_1f4 * fVar300 +
                        fStack_274 * fVar284 + fVar255 * fStack_414 + fVar205 * fStack_494);
    auVar46._12_4_ = fVar379;
    fVar380 = fVar226 * (fStack_1f0 * fVar309 +
                        fStack_270 * fVar287 + fVar256 * fStack_410 + fVar224 * fStack_490);
    auVar46._16_4_ = fVar380;
    fVar381 = fVar238 * (fStack_1ec * fVar310 +
                        fStack_26c * fVar288 + fVar257 * fStack_40c + fVar225 * fStack_48c);
    auVar46._20_4_ = fVar381;
    fVar382 = fVar259 * (fStack_1e8 * fVar312 +
                        fStack_268 * fVar291 + fVar280 * fStack_408 + fVar240 * fStack_488);
    auVar46._24_4_ = fVar382;
    auVar46._28_4_ = uStack_1c4;
    fVar383 = fVar226 * ((float)local_220._0_4_ * fVar292 +
                        fVar146 * (float)local_4c0._0_4_ + fVar227 * (float)local_440._0_4_ +
                        fVar275 * (float)local_3e0._0_4_);
    fVar394 = fVar238 * ((float)local_220._4_4_ * fVar295 +
                        fVar169 * (float)local_4c0._4_4_ + fVar239 * (float)local_440._4_4_ +
                        fVar279 * (float)local_3e0._4_4_);
    auVar390._4_4_ = fVar394;
    auVar390._0_4_ = fVar383;
    fVar396 = fVar259 * (fStack_218 * fVar296 +
                        fVar171 * fStack_4b8 + fVar241 * fStack_438 + fVar283 * fStack_3d8);
    auVar390._8_4_ = fVar396;
    fVar398 = fVar276 * (fStack_214 * fVar300 +
                        fVar205 * fStack_4b4 + fVar255 * fStack_434 + fVar284 * fStack_3d4);
    auVar390._12_4_ = fVar398;
    fVar400 = fVar226 * (fStack_210 * fVar309 +
                        fVar224 * fStack_4b0 + fVar256 * fStack_430 + fVar287 * fStack_3d0);
    auVar390._16_4_ = fVar400;
    fVar402 = fVar238 * (fStack_20c * fVar310 +
                        fVar225 * fStack_4ac + fVar257 * fStack_42c + fVar288 * fStack_3cc);
    auVar390._20_4_ = fVar402;
    fVar404 = fVar259 * (fStack_208 * fVar312 +
                        fVar240 * fStack_4a8 + fVar280 * fStack_428 + fVar291 * fStack_3c8);
    auVar390._24_4_ = fVar404;
    auVar390._28_4_ = uStack_1e4;
    fVar227 = fVar226 * ((float)local_240._0_4_ * fVar292 +
                        (float)local_2a0._0_4_ * fVar275 +
                        fVar146 * local_4e0._0_4_ + fVar227 * (float)local_460._0_4_);
    fVar239 = fVar238 * ((float)local_240._4_4_ * fVar295 +
                        (float)local_2a0._4_4_ * fVar279 +
                        fVar169 * local_4e0._4_4_ + fVar239 * (float)local_460._4_4_);
    auVar160._4_4_ = fVar239;
    auVar160._0_4_ = fVar227;
    fVar275 = fVar259 * (fStack_238 * fVar296 +
                        fStack_298 * fVar283 + fVar171 * local_4e0._8_4_ + fVar241 * fStack_458);
    auVar160._8_4_ = fVar275;
    fVar279 = fVar276 * (fStack_234 * fVar300 +
                        fStack_294 * fVar284 + fVar205 * local_4e0._12_4_ + fVar255 * fStack_454);
    auVar160._12_4_ = fVar279;
    fVar226 = fVar226 * (fStack_230 * fVar309 +
                        fStack_290 * fVar287 + fVar224 * local_4e0._16_4_ + fVar256 * fStack_450);
    auVar160._16_4_ = fVar226;
    fVar238 = fVar238 * (fStack_22c * fVar310 +
                        fStack_28c * fVar288 + fVar225 * local_4e0._20_4_ + fVar257 * fStack_44c);
    auVar160._20_4_ = fVar238;
    fVar259 = fVar259 * (fStack_228 * fVar312 +
                        fStack_288 * fVar291 + fVar240 * local_4e0._24_4_ + fVar280 * fStack_448);
    auVar160._24_4_ = fVar259;
    auVar160._28_4_ = fVar276;
    auVar40._4_4_ = fVar334;
    auVar40._0_4_ = fVar322;
    auVar40._8_4_ = fVar337;
    auVar40._12_4_ = fVar340;
    auVar40._16_4_ = fVar343;
    auVar40._20_4_ = fVar346;
    auVar40._24_4_ = fVar349;
    auVar40._28_4_ = fVar352;
    auVar127 = vperm2f128_avx(auVar40,auVar40,1);
    auVar127 = vshufps_avx(auVar127,auVar40,0x30);
    local_940 = vshufps_avx(auVar40,auVar127,0x29);
    auVar96._4_4_ = fStack_91c;
    auVar96._0_4_ = local_920;
    auVar96._8_4_ = fStack_918;
    auVar96._12_4_ = fStack_914;
    auVar96._16_4_ = fStack_910;
    auVar96._20_4_ = fStack_90c;
    auVar96._24_4_ = fStack_908;
    auVar96._28_4_ = fStack_904;
    auVar127 = vperm2f128_avx(auVar96,auVar96,1);
    auVar127 = vshufps_avx(auVar127,auVar96,0x30);
    auVar39 = vshufps_avx(auVar96,auVar127,0x29);
    auVar128 = vsubps_avx(_local_a80,auVar160);
    auVar127 = vperm2f128_avx(auVar128,auVar128,1);
    auVar127 = vshufps_avx(auVar127,auVar128,0x30);
    auVar160 = vshufps_avx(auVar128,auVar127,0x29);
    auVar40 = vsubps_avx(local_940,auVar40);
    auVar41 = vsubps_avx(auVar39,auVar96);
    fVar169 = auVar40._0_4_;
    fVar240 = auVar40._4_4_;
    auVar391._4_4_ = fVar394 * fVar240;
    auVar391._0_4_ = fVar383 * fVar169;
    fVar280 = auVar40._8_4_;
    auVar391._8_4_ = fVar396 * fVar280;
    fVar300 = auVar40._12_4_;
    auVar391._12_4_ = fVar398 * fVar300;
    fVar335 = auVar40._16_4_;
    auVar391._16_4_ = fVar400 * fVar335;
    fVar19 = auVar40._20_4_;
    auVar391._20_4_ = fVar402 * fVar19;
    fVar27 = auVar40._24_4_;
    auVar391._24_4_ = fVar404 * fVar27;
    auVar391._28_4_ = auVar128._28_4_;
    fVar171 = auVar41._0_4_;
    fVar241 = auVar41._4_4_;
    auVar193._4_4_ = fVar377 * fVar241;
    auVar193._0_4_ = fVar372 * fVar171;
    fVar283 = auVar41._8_4_;
    auVar193._8_4_ = fVar378 * fVar283;
    fVar309 = auVar41._12_4_;
    auVar193._12_4_ = fVar379 * fVar309;
    fVar338 = auVar41._16_4_;
    auVar193._16_4_ = fVar380 * fVar338;
    fVar20 = auVar41._20_4_;
    auVar193._20_4_ = fVar381 * fVar20;
    fVar28 = auVar41._24_4_;
    auVar193._24_4_ = fVar382 * fVar28;
    auVar193._28_4_ = auVar127._28_4_;
    auVar42 = vsubps_avx(auVar193,auVar391);
    auVar43._4_4_ = fVar333;
    auVar43._0_4_ = fVar321;
    auVar43._8_4_ = fVar336;
    auVar43._12_4_ = fVar339;
    auVar43._16_4_ = fVar342;
    auVar43._20_4_ = fVar345;
    auVar43._24_4_ = fVar348;
    auVar43._28_4_ = fVar351;
    auVar127 = vperm2f128_avx(auVar43,auVar43,1);
    auVar127 = vshufps_avx(auVar127,auVar43,0x30);
    auVar391 = vshufps_avx(auVar43,auVar127,0x29);
    auVar43 = vsubps_avx(auVar391,auVar43);
    auVar44._4_4_ = fVar241 * fVar277;
    auVar44._0_4_ = fVar171 * fVar261;
    auVar44._8_4_ = fVar283 * fVar281;
    auVar44._12_4_ = fVar309 * fVar285;
    auVar44._16_4_ = fVar338 * fVar289;
    auVar44._20_4_ = fVar20 * fVar293;
    auVar44._24_4_ = fVar28 * fVar297;
    auVar44._28_4_ = auVar391._28_4_;
    fVar205 = auVar43._0_4_;
    fVar255 = auVar43._4_4_;
    auVar45._4_4_ = fVar394 * fVar255;
    auVar45._0_4_ = fVar383 * fVar205;
    fVar284 = auVar43._8_4_;
    auVar45._8_4_ = fVar396 * fVar284;
    fVar310 = auVar43._12_4_;
    auVar45._12_4_ = fVar398 * fVar310;
    fVar341 = auVar43._16_4_;
    auVar45._16_4_ = fVar400 * fVar341;
    fVar21 = auVar43._20_4_;
    auVar45._20_4_ = fVar402 * fVar21;
    fVar29 = auVar43._24_4_;
    auVar45._24_4_ = fVar404 * fVar29;
    auVar45._28_4_ = fVar351;
    auVar193 = vsubps_avx(auVar45,auVar44);
    auVar47._4_4_ = fVar377 * fVar255;
    auVar47._0_4_ = fVar372 * fVar205;
    auVar47._8_4_ = fVar378 * fVar284;
    auVar47._12_4_ = fVar379 * fVar310;
    auVar47._16_4_ = fVar380 * fVar341;
    auVar47._20_4_ = fVar381 * fVar21;
    auVar47._24_4_ = fVar382 * fVar29;
    auVar47._28_4_ = fVar351;
    auVar375._4_4_ = fVar240 * fVar277;
    auVar375._0_4_ = fVar169 * fVar261;
    auVar375._8_4_ = fVar280 * fVar281;
    auVar375._12_4_ = fVar300 * fVar285;
    auVar375._16_4_ = fVar335 * fVar289;
    auVar375._20_4_ = fVar19 * fVar293;
    auVar375._24_4_ = fVar27 * fVar297;
    auVar375._28_4_ = uStack_204;
    auVar44 = vsubps_avx(auVar375,auVar47);
    fVar146 = auVar44._28_4_;
    auVar159._0_4_ = fVar205 * fVar205 + fVar169 * fVar169 + fVar171 * fVar171;
    auVar159._4_4_ = fVar255 * fVar255 + fVar240 * fVar240 + fVar241 * fVar241;
    auVar159._8_4_ = fVar284 * fVar284 + fVar280 * fVar280 + fVar283 * fVar283;
    auVar159._12_4_ = fVar310 * fVar310 + fVar300 * fVar300 + fVar309 * fVar309;
    auVar159._16_4_ = fVar341 * fVar341 + fVar335 * fVar335 + fVar338 * fVar338;
    auVar159._20_4_ = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
    auVar159._24_4_ = fVar29 * fVar29 + fVar27 * fVar27 + fVar28 * fVar28;
    auVar159._28_4_ = fVar146 + fVar146 + auVar42._28_4_;
    auVar127 = vrcpps_avx(auVar159);
    fVar291 = auVar127._0_4_;
    fVar292 = auVar127._4_4_;
    auVar48._4_4_ = fVar292 * auVar159._4_4_;
    auVar48._0_4_ = fVar291 * auVar159._0_4_;
    fVar295 = auVar127._8_4_;
    auVar48._8_4_ = fVar295 * auVar159._8_4_;
    fVar296 = auVar127._12_4_;
    auVar48._12_4_ = fVar296 * auVar159._12_4_;
    fVar316 = auVar127._16_4_;
    auVar48._16_4_ = fVar316 * auVar159._16_4_;
    fVar318 = auVar127._20_4_;
    auVar48._20_4_ = fVar318 * auVar159._20_4_;
    fVar320 = auVar127._24_4_;
    auVar48._24_4_ = fVar320 * auVar159._24_4_;
    auVar48._28_4_ = uStack_204;
    auVar235._8_4_ = 0x3f800000;
    auVar235._0_8_ = 0x3f8000003f800000;
    auVar235._12_4_ = 0x3f800000;
    auVar235._16_4_ = 0x3f800000;
    auVar235._20_4_ = 0x3f800000;
    auVar235._24_4_ = 0x3f800000;
    auVar235._28_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar235,auVar48);
    fVar291 = auVar45._0_4_ * fVar291 + fVar291;
    fVar292 = auVar45._4_4_ * fVar292 + fVar292;
    fVar295 = auVar45._8_4_ * fVar295 + fVar295;
    fVar296 = auVar45._12_4_ * fVar296 + fVar296;
    fVar316 = auVar45._16_4_ * fVar316 + fVar316;
    fVar318 = auVar45._20_4_ * fVar318 + fVar318;
    fVar320 = auVar45._24_4_ * fVar320 + fVar320;
    auVar128 = vperm2f128_avx(auVar46,auVar46,1);
    auVar128 = vshufps_avx(auVar128,auVar46,0x30);
    local_9e0 = vshufps_avx(auVar46,auVar128,0x29);
    auVar128 = vperm2f128_avx(auVar390,auVar390,1);
    auVar128 = vshufps_avx(auVar128,auVar390,0x30);
    local_7e0 = vshufps_avx(auVar390,auVar128,0x29);
    fVar384 = local_7e0._0_4_;
    fVar395 = local_7e0._4_4_;
    auVar49._4_4_ = fVar395 * fVar240;
    auVar49._0_4_ = fVar384 * fVar169;
    fVar397 = local_7e0._8_4_;
    auVar49._8_4_ = fVar397 * fVar280;
    fVar399 = local_7e0._12_4_;
    auVar49._12_4_ = fVar399 * fVar300;
    fVar401 = local_7e0._16_4_;
    auVar49._16_4_ = fVar401 * fVar335;
    fVar403 = local_7e0._20_4_;
    auVar49._20_4_ = fVar403 * fVar19;
    fVar405 = local_7e0._24_4_;
    auVar49._24_4_ = fVar405 * fVar27;
    auVar49._28_4_ = auVar128._28_4_;
    fVar224 = local_9e0._0_4_;
    fVar256 = local_9e0._4_4_;
    auVar51._4_4_ = fVar241 * fVar256;
    auVar51._0_4_ = fVar171 * fVar224;
    fVar287 = local_9e0._8_4_;
    auVar51._8_4_ = fVar283 * fVar287;
    fVar312 = local_9e0._12_4_;
    auVar51._12_4_ = fVar309 * fVar312;
    fVar344 = local_9e0._16_4_;
    auVar51._16_4_ = fVar338 * fVar344;
    fVar22 = local_9e0._20_4_;
    auVar51._20_4_ = fVar20 * fVar22;
    fVar30 = local_9e0._24_4_;
    auVar51._24_4_ = fVar28 * fVar30;
    auVar51._28_4_ = uStack_1c4;
    auVar46 = vsubps_avx(auVar51,auVar49);
    auVar128 = vperm2f128_avx(auVar50,auVar50,1);
    auVar128 = vshufps_avx(auVar128,auVar50,0x30);
    local_7c0 = vshufps_avx(auVar50,auVar128,0x29);
    fVar225 = local_7c0._0_4_;
    fVar257 = local_7c0._4_4_;
    auVar52._4_4_ = fVar241 * fVar257;
    auVar52._0_4_ = fVar171 * fVar225;
    fVar288 = local_7c0._8_4_;
    auVar52._8_4_ = fVar283 * fVar288;
    fVar314 = local_7c0._12_4_;
    auVar52._12_4_ = fVar309 * fVar314;
    fVar347 = local_7c0._16_4_;
    auVar52._16_4_ = fVar338 * fVar347;
    fVar23 = local_7c0._20_4_;
    auVar52._20_4_ = fVar20 * fVar23;
    fVar31 = local_7c0._24_4_;
    auVar52._24_4_ = fVar28 * fVar31;
    auVar52._28_4_ = auVar128._28_4_;
    auVar53._4_4_ = fVar395 * fVar255;
    auVar53._0_4_ = fVar384 * fVar205;
    auVar53._8_4_ = fVar397 * fVar284;
    auVar53._12_4_ = fVar399 * fVar310;
    auVar53._16_4_ = fVar401 * fVar341;
    auVar53._20_4_ = fVar403 * fVar21;
    uVar103 = local_7e0._28_4_;
    auVar53._24_4_ = fVar405 * fVar29;
    auVar53._28_4_ = uVar103;
    auVar128 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar255 * fVar256;
    auVar54._0_4_ = fVar205 * fVar224;
    auVar54._8_4_ = fVar284 * fVar287;
    auVar54._12_4_ = fVar310 * fVar312;
    auVar54._16_4_ = fVar341 * fVar344;
    auVar54._20_4_ = fVar21 * fVar22;
    auVar54._24_4_ = fVar29 * fVar30;
    auVar54._28_4_ = uVar103;
    auVar55._4_4_ = fVar240 * fVar257;
    auVar55._0_4_ = fVar169 * fVar225;
    auVar55._8_4_ = fVar280 * fVar288;
    auVar55._12_4_ = fVar300 * fVar314;
    auVar55._16_4_ = fVar335 * fVar347;
    auVar55._20_4_ = fVar19 * fVar23;
    auVar55._24_4_ = fVar27 * fVar31;
    auVar55._28_4_ = fVar352;
    auVar390 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ =
         (auVar42._4_4_ * auVar42._4_4_ +
         auVar193._4_4_ * auVar193._4_4_ + auVar44._4_4_ * auVar44._4_4_) * fVar292;
    auVar56._0_4_ =
         (auVar42._0_4_ * auVar42._0_4_ +
         auVar193._0_4_ * auVar193._0_4_ + auVar44._0_4_ * auVar44._0_4_) * fVar291;
    auVar56._8_4_ =
         (auVar42._8_4_ * auVar42._8_4_ +
         auVar193._8_4_ * auVar193._8_4_ + auVar44._8_4_ * auVar44._8_4_) * fVar295;
    auVar56._12_4_ =
         (auVar42._12_4_ * auVar42._12_4_ +
         auVar193._12_4_ * auVar193._12_4_ + auVar44._12_4_ * auVar44._12_4_) * fVar296;
    auVar56._16_4_ =
         (auVar42._16_4_ * auVar42._16_4_ +
         auVar193._16_4_ * auVar193._16_4_ + auVar44._16_4_ * auVar44._16_4_) * fVar316;
    auVar56._20_4_ =
         (auVar42._20_4_ * auVar42._20_4_ +
         auVar193._20_4_ * auVar193._20_4_ + auVar44._20_4_ * auVar44._20_4_) * fVar318;
    auVar56._24_4_ =
         (auVar42._24_4_ * auVar42._24_4_ +
         auVar193._24_4_ * auVar193._24_4_ + auVar44._24_4_ * auVar44._24_4_) * fVar320;
    auVar56._28_4_ = auVar42._28_4_ + auVar193._28_4_ + fVar146;
    auVar57._4_4_ =
         (auVar46._4_4_ * auVar46._4_4_ +
         auVar128._4_4_ * auVar128._4_4_ + auVar390._4_4_ * auVar390._4_4_) * fVar292;
    auVar57._0_4_ =
         (auVar46._0_4_ * auVar46._0_4_ +
         auVar128._0_4_ * auVar128._0_4_ + auVar390._0_4_ * auVar390._0_4_) * fVar291;
    auVar57._8_4_ =
         (auVar46._8_4_ * auVar46._8_4_ +
         auVar128._8_4_ * auVar128._8_4_ + auVar390._8_4_ * auVar390._8_4_) * fVar295;
    auVar57._12_4_ =
         (auVar46._12_4_ * auVar46._12_4_ +
         auVar128._12_4_ * auVar128._12_4_ + auVar390._12_4_ * auVar390._12_4_) * fVar296;
    auVar57._16_4_ =
         (auVar46._16_4_ * auVar46._16_4_ +
         auVar128._16_4_ * auVar128._16_4_ + auVar390._16_4_ * auVar390._16_4_) * fVar316;
    auVar57._20_4_ =
         (auVar46._20_4_ * auVar46._20_4_ +
         auVar128._20_4_ * auVar128._20_4_ + auVar390._20_4_ * auVar390._20_4_) * fVar318;
    auVar57._24_4_ =
         (auVar46._24_4_ * auVar46._24_4_ +
         auVar128._24_4_ * auVar128._24_4_ + auVar390._24_4_ * auVar390._24_4_) * fVar320;
    auVar57._28_4_ = auVar45._28_4_ + auVar127._28_4_;
    auVar127 = vmaxps_avx(auVar56,auVar57);
    auVar128 = vperm2f128_avx(_local_a80,_local_a80,1);
    auVar128 = vshufps_avx(auVar128,_local_a80,0x30);
    auVar193 = vshufps_avx(_local_a80,auVar128,0x29);
    auVar129._0_4_ = (float)local_a80._0_4_ + fVar227;
    auVar129._4_4_ = (float)local_a80._4_4_ + fVar239;
    auVar129._8_4_ = fStack_a78 + fVar275;
    auVar129._12_4_ = fStack_a74 + fVar279;
    auVar129._16_4_ = fStack_a70 + fVar226;
    auVar129._20_4_ = fStack_a6c + fVar238;
    auVar129._24_4_ = fStack_a68 + fVar259;
    auVar129._28_4_ = fStack_a64 + fVar276;
    auVar128 = vmaxps_avx(_local_a80,auVar129);
    auVar42 = vmaxps_avx(auVar160,auVar193);
    auVar128 = vmaxps_avx(auVar128,auVar42);
    auVar42 = vrsqrtps_avx(auVar159);
    fVar146 = auVar42._0_4_;
    fVar226 = auVar42._4_4_;
    fVar227 = auVar42._8_4_;
    fVar238 = auVar42._12_4_;
    fVar239 = auVar42._16_4_;
    fVar259 = auVar42._20_4_;
    fVar275 = auVar42._24_4_;
    auVar58._4_4_ = fVar226 * fVar226 * fVar226 * auVar159._4_4_ * 0.5;
    auVar58._0_4_ = fVar146 * fVar146 * fVar146 * auVar159._0_4_ * 0.5;
    auVar58._8_4_ = fVar227 * fVar227 * fVar227 * auVar159._8_4_ * 0.5;
    auVar58._12_4_ = fVar238 * fVar238 * fVar238 * auVar159._12_4_ * 0.5;
    auVar58._16_4_ = fVar239 * fVar239 * fVar239 * auVar159._16_4_ * 0.5;
    auVar58._20_4_ = fVar259 * fVar259 * fVar259 * auVar159._20_4_ * 0.5;
    auVar58._24_4_ = fVar275 * fVar275 * fVar275 * auVar159._24_4_ * 0.5;
    auVar58._28_4_ = auVar159._28_4_;
    auVar59._4_4_ = fVar226 * 1.5;
    auVar59._0_4_ = fVar146 * 1.5;
    auVar59._8_4_ = fVar227 * 1.5;
    auVar59._12_4_ = fVar238 * 1.5;
    auVar59._16_4_ = fVar239 * 1.5;
    auVar59._20_4_ = fVar259 * 1.5;
    auVar59._24_4_ = fVar275 * 1.5;
    auVar59._28_4_ = auVar42._28_4_;
    local_540 = vsubps_avx(auVar59,auVar58);
    auVar90 = ZEXT412(0);
    auVar376 = ZEXT1264(auVar90) << 0x20;
    auVar92._4_4_ = fVar334;
    auVar92._0_4_ = fVar322;
    auVar92._8_4_ = fVar337;
    auVar92._12_4_ = fVar340;
    auVar92._16_4_ = fVar343;
    auVar92._20_4_ = fVar346;
    auVar92._24_4_ = fVar349;
    auVar92._28_4_ = fVar352;
    auVar44 = vsubps_avx(ZEXT1232(auVar90) << 0x20,auVar92);
    auVar45 = vsubps_avx(ZEXT1232(auVar90) << 0x20,auVar96);
    fVar226 = auVar45._0_4_;
    fVar259 = auVar45._4_4_;
    fVar291 = auVar45._8_4_;
    fVar316 = auVar45._12_4_;
    fVar350 = auVar45._16_4_;
    fVar24 = auVar45._20_4_;
    fVar32 = auVar45._24_4_;
    fVar227 = auVar44._0_4_;
    fVar275 = auVar44._4_4_;
    fVar292 = auVar44._8_4_;
    fVar318 = auVar44._12_4_;
    fVar360 = auVar44._16_4_;
    fVar25 = auVar44._20_4_;
    fVar33 = auVar44._24_4_;
    auVar93._4_4_ = fVar333;
    auVar93._0_4_ = fVar321;
    auVar93._8_4_ = fVar336;
    auVar93._12_4_ = fVar339;
    auVar93._16_4_ = fVar342;
    auVar93._20_4_ = fVar345;
    auVar93._24_4_ = fVar348;
    auVar93._28_4_ = fVar351;
    auVar375 = ZEXT1232(auVar90) << 0x20;
    auVar46 = vsubps_avx(auVar375,auVar93);
    fVar238 = auVar46._0_4_;
    fVar276 = auVar46._4_4_;
    fVar295 = auVar46._8_4_;
    fVar320 = auVar46._12_4_;
    fVar361 = auVar46._16_4_;
    fVar26 = auVar46._20_4_;
    fVar34 = auVar46._24_4_;
    auVar387._0_4_ =
         (float)local_a20._0_4_ * fVar238 +
         (float)local_980._0_4_ * fVar227 + (float)local_800._0_4_ * fVar226;
    auVar387._4_4_ =
         (float)local_a20._4_4_ * fVar276 +
         (float)local_980._4_4_ * fVar275 + (float)local_800._4_4_ * fVar259;
    auVar387._8_4_ = fStack_a18 * fVar295 + fStack_978 * fVar292 + fStack_7f8 * fVar291;
    auVar387._12_4_ = fStack_a14 * fVar320 + fStack_974 * fVar318 + fStack_7f4 * fVar316;
    auVar387._16_4_ = fStack_a10 * fVar361 + fStack_970 * fVar360 + fStack_7f0 * fVar350;
    auVar387._20_4_ = fStack_a0c * fVar26 + fStack_96c * fVar25 + fStack_7ec * fVar24;
    auVar387._24_4_ = fStack_a08 * fVar34 + fStack_968 * fVar33 + fStack_7e8 * fVar32;
    auVar387._28_4_ = fVar352 + auVar390._28_4_ + auVar42._28_4_;
    auVar406._0_4_ = fVar238 * fVar238 + fVar227 * fVar227 + fVar226 * fVar226;
    auVar406._4_4_ = fVar276 * fVar276 + fVar275 * fVar275 + fVar259 * fVar259;
    auVar406._8_4_ = fVar295 * fVar295 + fVar292 * fVar292 + fVar291 * fVar291;
    auVar406._12_4_ = fVar320 * fVar320 + fVar318 * fVar318 + fVar316 * fVar316;
    auVar406._16_4_ = fVar361 * fVar361 + fVar360 * fVar360 + fVar350 * fVar350;
    auVar406._20_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
    auVar406._24_4_ = fVar34 * fVar34 + fVar33 * fVar33 + fVar32 * fVar32;
    auVar406._28_4_ = fStack_a64 + fStack_a64 + fVar352;
    fVar239 = local_540._0_4_;
    fVar279 = local_540._4_4_;
    fVar296 = local_540._8_4_;
    fVar332 = local_540._12_4_;
    fVar371 = local_540._16_4_;
    fVar258 = local_540._20_4_;
    fVar260 = local_540._24_4_;
    local_580 = (float)local_a20._0_4_ * fVar205 * fVar239 +
                fVar169 * fVar239 * (float)local_980._0_4_ +
                fVar171 * fVar239 * (float)local_800._0_4_;
    fStack_57c = (float)local_a20._4_4_ * fVar255 * fVar279 +
                 fVar240 * fVar279 * (float)local_980._4_4_ +
                 fVar241 * fVar279 * (float)local_800._4_4_;
    fStack_578 = fStack_a18 * fVar284 * fVar296 +
                 fVar280 * fVar296 * fStack_978 + fVar283 * fVar296 * fStack_7f8;
    fStack_574 = fStack_a14 * fVar310 * fVar332 +
                 fVar300 * fVar332 * fStack_974 + fVar309 * fVar332 * fStack_7f4;
    fStack_570 = fStack_a10 * fVar341 * fVar371 +
                 fVar335 * fVar371 * fStack_970 + fVar338 * fVar371 * fStack_7f0;
    fStack_56c = fStack_a0c * fVar21 * fVar258 +
                 fVar19 * fVar258 * fStack_96c + fVar20 * fVar258 * fStack_7ec;
    fStack_568 = fStack_a08 * fVar29 * fVar260 +
                 fVar27 * fVar260 * fStack_968 + fVar28 * fVar260 * fStack_7e8;
    fStack_564 = fStack_a04 + fStack_964 + fStack_7e4;
    fVar146 = fStack_a04 + fStack_964 + fStack_7e4;
    local_a00._0_4_ =
         fVar238 * fVar205 * fVar239 + fVar169 * fVar239 * fVar227 + fVar171 * fVar239 * fVar226;
    local_a00._4_4_ =
         fVar276 * fVar255 * fVar279 + fVar240 * fVar279 * fVar275 + fVar241 * fVar279 * fVar259;
    local_a00._8_4_ =
         fVar295 * fVar284 * fVar296 + fVar280 * fVar296 * fVar292 + fVar283 * fVar296 * fVar291;
    local_a00._12_4_ =
         fVar320 * fVar310 * fVar332 + fVar300 * fVar332 * fVar318 + fVar309 * fVar332 * fVar316;
    local_a00._16_4_ =
         fVar361 * fVar341 * fVar371 + fVar335 * fVar371 * fVar360 + fVar338 * fVar371 * fVar350;
    local_a00._20_4_ =
         fVar26 * fVar21 * fVar258 + fVar19 * fVar258 * fVar25 + fVar20 * fVar258 * fVar24;
    local_a00._24_4_ =
         fVar34 * fVar29 * fVar260 + fVar27 * fVar260 * fVar33 + fVar28 * fVar260 * fVar32;
    local_a00._28_4_ = fStack_964 + fVar146;
    auVar60._4_4_ = fStack_57c * local_a00._4_4_;
    auVar60._0_4_ = local_580 * (float)local_a00._0_4_;
    auVar60._8_4_ = fStack_578 * local_a00._8_4_;
    auVar60._12_4_ = fStack_574 * local_a00._12_4_;
    auVar60._16_4_ = fStack_570 * local_a00._16_4_;
    auVar60._20_4_ = fStack_56c * local_a00._20_4_;
    auVar60._24_4_ = fStack_568 * local_a00._24_4_;
    auVar60._28_4_ = fVar146;
    auVar390 = vsubps_avx(auVar387,auVar60);
    auVar61._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    auVar61._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar61._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    auVar61._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    auVar61._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    auVar61._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    auVar61._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    auVar61._28_4_ = fStack_964;
    auVar47 = vsubps_avx(auVar406,auVar61);
    auVar42 = vsqrtps_avx(auVar127);
    fVar146 = (auVar42._0_4_ + auVar128._0_4_) * 1.0000002;
    fVar138 = (auVar42._4_4_ + auVar128._4_4_) * 1.0000002;
    fVar139 = (auVar42._8_4_ + auVar128._8_4_) * 1.0000002;
    fVar140 = (auVar42._12_4_ + auVar128._12_4_) * 1.0000002;
    fVar141 = (auVar42._16_4_ + auVar128._16_4_) * 1.0000002;
    fVar142 = (auVar42._20_4_ + auVar128._20_4_) * 1.0000002;
    fVar143 = (auVar42._24_4_ + auVar128._24_4_) * 1.0000002;
    auVar62._4_4_ = fVar138 * fVar138;
    auVar62._0_4_ = fVar146 * fVar146;
    auVar62._8_4_ = fVar139 * fVar139;
    auVar62._12_4_ = fVar140 * fVar140;
    auVar62._16_4_ = fVar141 * fVar141;
    auVar62._20_4_ = fVar142 * fVar142;
    auVar62._24_4_ = fVar143 * fVar143;
    auVar62._28_4_ = auVar42._28_4_ + auVar128._28_4_;
    fVar138 = auVar390._0_4_ + auVar390._0_4_;
    fVar139 = auVar390._4_4_ + auVar390._4_4_;
    local_960._0_8_ = CONCAT44(fVar139,fVar138);
    local_960._8_4_ = auVar390._8_4_ + auVar390._8_4_;
    local_960._12_4_ = auVar390._12_4_ + auVar390._12_4_;
    local_960._16_4_ = auVar390._16_4_ + auVar390._16_4_;
    local_960._20_4_ = auVar390._20_4_ + auVar390._20_4_;
    local_960._24_4_ = auVar390._24_4_ + auVar390._24_4_;
    fVar146 = auVar390._28_4_;
    local_960._28_4_ = fVar146 + fVar146;
    auVar128 = vsubps_avx(auVar47,auVar62);
    local_340._4_4_ = fStack_57c * fStack_57c;
    local_340._0_4_ = local_580 * local_580;
    local_340._8_4_ = fStack_578 * fStack_578;
    local_340._12_4_ = fStack_574 * fStack_574;
    local_340._16_4_ = fStack_570 * fStack_570;
    local_340._20_4_ = fStack_56c * fStack_56c;
    local_340._24_4_ = fStack_568 * fStack_568;
    local_340._28_4_ = auVar41._28_4_;
    auVar370 = ZEXT3264(local_340);
    local_560 = vsubps_avx(local_2c0,local_340);
    auVar356 = ZEXT3264(local_560);
    auVar63._4_4_ = fVar139 * fVar139;
    auVar63._0_4_ = fVar138 * fVar138;
    auVar63._8_4_ = local_960._8_4_ * local_960._8_4_;
    auVar63._12_4_ = local_960._12_4_ * local_960._12_4_;
    auVar63._16_4_ = local_960._16_4_ * local_960._16_4_;
    auVar63._20_4_ = local_960._20_4_ * local_960._20_4_;
    auVar63._24_4_ = local_960._24_4_ * local_960._24_4_;
    auVar63._28_4_ = fVar146;
    fVar140 = local_560._0_4_;
    fVar141 = local_560._4_4_;
    fVar142 = local_560._8_4_;
    fVar143 = local_560._12_4_;
    fVar357 = local_560._16_4_;
    fVar358 = local_560._20_4_;
    fVar359 = local_560._24_4_;
    auVar41._4_4_ = auVar128._4_4_ * fVar141 * 4.0;
    auVar41._0_4_ = auVar128._0_4_ * fVar140 * 4.0;
    auVar41._8_4_ = auVar128._8_4_ * fVar142 * 4.0;
    auVar41._12_4_ = auVar128._12_4_ * fVar143 * 4.0;
    auVar41._16_4_ = auVar128._16_4_ * fVar357 * 4.0;
    auVar41._20_4_ = auVar128._20_4_ * fVar358 * 4.0;
    auVar41._24_4_ = auVar128._24_4_ * fVar359 * 4.0;
    auVar41._28_4_ = 0x40800000;
    auVar41 = vsubps_avx(auVar63,auVar41);
    auVar127 = vcmpps_avx(auVar41,auVar375,5);
    fVar146 = local_560._28_4_;
    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar127 >> 0x7f,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar127 >> 0xbf,0) == '\0') &&
        (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar127[0x1f])
    {
      local_bc0._8_4_ = 0x7f800000;
      local_bc0._0_8_ = 0x7f8000007f800000;
      local_bc0._12_4_ = 0x7f800000;
      local_bc0._16_4_ = 0x7f800000;
      local_bc0._20_4_ = 0x7f800000;
      local_bc0._24_4_ = 0x7f800000;
      local_bc0._28_4_ = 0x7f800000;
      auVar407._8_4_ = 0xff800000;
      auVar407._0_8_ = 0xff800000ff800000;
      auVar407._12_4_ = 0xff800000;
      auVar407._16_4_ = 0xff800000;
      auVar407._20_4_ = 0xff800000;
      auVar407._24_4_ = 0xff800000;
      auVar407._28_4_ = 0xff800000;
    }
    else {
      auVar390 = vcmpps_avx(auVar41,auVar375,5);
      auVar376 = ZEXT3264(auVar390);
      auVar375 = vsqrtps_avx(auVar41);
      auVar267._0_4_ = fVar140 + fVar140;
      auVar267._4_4_ = fVar141 + fVar141;
      auVar267._8_4_ = fVar142 + fVar142;
      auVar267._12_4_ = fVar143 + fVar143;
      auVar267._16_4_ = fVar357 + fVar357;
      auVar267._20_4_ = fVar358 + fVar358;
      auVar267._24_4_ = fVar359 + fVar359;
      auVar267._28_4_ = fVar146 + fVar146;
      auVar41 = vrcpps_avx(auVar267);
      fVar262 = auVar41._0_4_;
      fVar278 = auVar41._4_4_;
      auVar64._4_4_ = auVar267._4_4_ * fVar278;
      auVar64._0_4_ = auVar267._0_4_ * fVar262;
      fVar282 = auVar41._8_4_;
      auVar64._8_4_ = auVar267._8_4_ * fVar282;
      fVar286 = auVar41._12_4_;
      auVar64._12_4_ = auVar267._12_4_ * fVar286;
      fVar290 = auVar41._16_4_;
      auVar64._16_4_ = auVar267._16_4_ * fVar290;
      fVar294 = auVar41._20_4_;
      auVar64._20_4_ = auVar267._20_4_ * fVar294;
      fVar298 = auVar41._24_4_;
      auVar64._24_4_ = auVar267._24_4_ * fVar298;
      auVar64._28_4_ = auVar267._28_4_;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar48 = vsubps_avx(auVar328,auVar64);
      fVar262 = fVar262 + fVar262 * auVar48._0_4_;
      fVar278 = fVar278 + fVar278 * auVar48._4_4_;
      fVar282 = fVar282 + fVar282 * auVar48._8_4_;
      fVar286 = fVar286 + fVar286 * auVar48._12_4_;
      fVar290 = fVar290 + fVar290 * auVar48._16_4_;
      fVar294 = fVar294 + fVar294 * auVar48._20_4_;
      fVar298 = fVar298 + fVar298 * auVar48._24_4_;
      auVar306._0_8_ = CONCAT44(fVar139,fVar138) ^ 0x8000000080000000;
      auVar306._8_4_ = -local_960._8_4_;
      auVar306._12_4_ = -local_960._12_4_;
      auVar306._16_4_ = -local_960._16_4_;
      auVar306._20_4_ = -local_960._20_4_;
      auVar306._24_4_ = -local_960._24_4_;
      auVar306._28_4_ = -local_960._28_4_;
      auVar49 = vsubps_avx(auVar306,auVar375);
      fVar138 = auVar49._0_4_ * fVar262;
      fVar139 = auVar49._4_4_ * fVar278;
      auVar65._4_4_ = fVar139;
      auVar65._0_4_ = fVar138;
      fVar311 = auVar49._8_4_ * fVar282;
      auVar65._8_4_ = fVar311;
      fVar313 = auVar49._12_4_ * fVar286;
      auVar65._12_4_ = fVar313;
      fVar315 = auVar49._16_4_ * fVar290;
      auVar65._16_4_ = fVar315;
      fVar317 = auVar49._20_4_ * fVar294;
      auVar65._20_4_ = fVar317;
      fVar319 = auVar49._24_4_ * fVar298;
      auVar65._24_4_ = fVar319;
      auVar65._28_4_ = auVar49._28_4_;
      auVar375 = vsubps_avx(auVar375,local_960);
      fVar262 = auVar375._0_4_ * fVar262;
      fVar278 = auVar375._4_4_ * fVar278;
      auVar66._4_4_ = fVar278;
      auVar66._0_4_ = fVar262;
      fVar282 = auVar375._8_4_ * fVar282;
      auVar66._8_4_ = fVar282;
      fVar286 = auVar375._12_4_ * fVar286;
      auVar66._12_4_ = fVar286;
      fVar290 = auVar375._16_4_ * fVar290;
      auVar66._16_4_ = fVar290;
      fVar294 = auVar375._20_4_ * fVar294;
      auVar66._20_4_ = fVar294;
      fVar298 = auVar375._24_4_ * fVar298;
      auVar66._24_4_ = fVar298;
      auVar66._28_4_ = auVar375._28_4_;
      local_300 = fVar239 * ((float)local_a00._0_4_ + local_580 * fVar138);
      fStack_2fc = fVar279 * (local_a00._4_4_ + fStack_57c * fVar139);
      fStack_2f8 = fVar296 * (local_a00._8_4_ + fStack_578 * fVar311);
      fStack_2f4 = fVar332 * (local_a00._12_4_ + fStack_574 * fVar313);
      fStack_2f0 = fVar371 * (local_a00._16_4_ + fStack_570 * fVar315);
      fStack_2ec = fVar258 * (local_a00._20_4_ + fStack_56c * fVar317);
      fStack_2e8 = fVar260 * (local_a00._24_4_ + fStack_568 * fVar319);
      fStack_2e4 = local_a00._28_4_ + auVar41._28_4_ + auVar48._28_4_;
      auVar388._8_4_ = 0x7fffffff;
      auVar388._0_8_ = 0x7fffffff7fffffff;
      auVar388._12_4_ = 0x7fffffff;
      auVar388._16_4_ = 0x7fffffff;
      auVar388._20_4_ = 0x7fffffff;
      auVar388._24_4_ = 0x7fffffff;
      auVar388._28_4_ = 0x7fffffff;
      auVar41 = vandps_avx(local_340,auVar388);
      auVar375 = vmaxps_avx(local_520,auVar41);
      auVar67._4_4_ = auVar375._4_4_ * 1.9073486e-06;
      auVar67._0_4_ = auVar375._0_4_ * 1.9073486e-06;
      auVar67._8_4_ = auVar375._8_4_ * 1.9073486e-06;
      auVar67._12_4_ = auVar375._12_4_ * 1.9073486e-06;
      auVar67._16_4_ = auVar375._16_4_ * 1.9073486e-06;
      auVar67._20_4_ = auVar375._20_4_ * 1.9073486e-06;
      auVar67._24_4_ = auVar375._24_4_ * 1.9073486e-06;
      auVar67._28_4_ = auVar375._28_4_;
      auVar41 = vandps_avx(local_560,auVar388);
      auVar41 = vcmpps_avx(auVar41,auVar67,1);
      auVar329._8_4_ = 0x7f800000;
      auVar329._0_8_ = 0x7f8000007f800000;
      auVar329._12_4_ = 0x7f800000;
      auVar329._16_4_ = 0x7f800000;
      auVar329._20_4_ = 0x7f800000;
      auVar329._24_4_ = 0x7f800000;
      auVar329._28_4_ = 0x7f800000;
      local_bc0 = vblendvps_avx(auVar329,auVar65,auVar390);
      local_320 = fVar239 * ((float)local_a00._0_4_ + local_580 * fVar262);
      fStack_31c = fVar279 * (local_a00._4_4_ + fStack_57c * fVar278);
      fStack_318 = fVar296 * (local_a00._8_4_ + fStack_578 * fVar282);
      fStack_314 = fVar332 * (local_a00._12_4_ + fStack_574 * fVar286);
      fStack_310 = fVar371 * (local_a00._16_4_ + fStack_570 * fVar290);
      fStack_30c = fVar258 * (local_a00._20_4_ + fStack_56c * fVar294);
      fStack_308 = fVar260 * (local_a00._24_4_ + fStack_568 * fVar298);
      fStack_304 = local_a00._28_4_ + auVar375._28_4_;
      auVar268._8_4_ = 0xff800000;
      auVar268._0_8_ = 0xff800000ff800000;
      auVar268._12_4_ = 0xff800000;
      auVar268._16_4_ = 0xff800000;
      auVar268._20_4_ = 0xff800000;
      auVar268._24_4_ = 0xff800000;
      auVar268._28_4_ = 0xff800000;
      auVar407 = vblendvps_avx(auVar268,auVar66,auVar390);
      auVar375 = auVar390 & auVar41;
      if ((((((((auVar375 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar375 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar375 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar375 >> 0x7f,0) != '\0') ||
            (auVar375 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar375 >> 0xbf,0) != '\0') ||
          (auVar375 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar375[0x1f] < '\0') {
        auVar127 = vandps_avx(auVar41,auVar390);
        auVar188 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
        auVar41 = vcmpps_avx(auVar128,ZEXT832(0) << 0x20,2);
        auVar392._8_4_ = 0xff800000;
        auVar392._0_8_ = 0xff800000ff800000;
        auVar392._12_4_ = 0xff800000;
        auVar392._16_4_ = 0xff800000;
        auVar392._20_4_ = 0xff800000;
        auVar392._24_4_ = 0xff800000;
        auVar392._28_4_ = 0xff800000;
        auVar409._8_4_ = 0x7f800000;
        auVar409._0_8_ = 0x7f8000007f800000;
        auVar409._12_4_ = 0x7f800000;
        auVar409._16_4_ = 0x7f800000;
        auVar409._20_4_ = 0x7f800000;
        auVar409._24_4_ = 0x7f800000;
        auVar409._28_4_ = 0x7f800000;
        auVar128 = vblendvps_avx(auVar409,auVar392,auVar41);
        auVar184 = vpmovsxwd_avx(auVar188);
        auVar188 = vpunpckhwd_avx(auVar188,auVar188);
        auVar254._16_16_ = auVar188;
        auVar254._0_16_ = auVar184;
        local_bc0 = vblendvps_avx(local_bc0,auVar128,auVar254);
        auVar128 = vblendvps_avx(auVar392,auVar409,auVar41);
        auVar407 = vblendvps_avx(auVar407,auVar128,auVar254);
        auVar128 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar136._0_4_ = auVar127._0_4_ ^ auVar128._0_4_;
        auVar136._4_4_ = auVar127._4_4_ ^ auVar128._4_4_;
        auVar136._8_4_ = auVar127._8_4_ ^ auVar128._8_4_;
        auVar136._12_4_ = auVar127._12_4_ ^ auVar128._12_4_;
        auVar136._16_4_ = auVar127._16_4_ ^ auVar128._16_4_;
        auVar136._20_4_ = auVar127._20_4_ ^ auVar128._20_4_;
        auVar136._24_4_ = auVar127._24_4_ ^ auVar128._24_4_;
        auVar136._28_4_ = auVar127._28_4_ ^ auVar128._28_4_;
        auVar127 = vorps_avx(auVar41,auVar136);
        auVar127 = vandps_avx(auVar390,auVar127);
      }
    }
    auVar365 = ZEXT3264(local_a00);
    auVar308 = ZEXT3264(local_960);
    auVar128 = local_500 & auVar127;
    auVar274 = ZEXT3264(_local_980);
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0x7f,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar128 >> 0xbf,0) != '\0') ||
        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar128[0x1f] < '\0') {
      local_8a0 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar188 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_890._0_4_));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar249._16_16_ = auVar188;
      auVar249._0_16_ = auVar188;
      auVar390 = vminps_avx(auVar249,auVar407);
      fVar294 = auVar45._28_4_;
      auVar365 = ZEXT3264(_local_800);
      auVar192._0_4_ =
           (float)local_a20._0_4_ * fVar261 +
           (float)local_980._0_4_ * fVar372 + (float)local_800._0_4_ * fVar383;
      auVar192._4_4_ =
           (float)local_a20._4_4_ * fVar277 +
           (float)local_980._4_4_ * fVar377 + (float)local_800._4_4_ * fVar394;
      auVar192._8_4_ = fStack_a18 * fVar281 + fStack_978 * fVar378 + fStack_7f8 * fVar396;
      auVar192._12_4_ = fStack_a14 * fVar285 + fStack_974 * fVar379 + fStack_7f4 * fVar398;
      auVar192._16_4_ = fStack_a10 * fVar289 + fStack_970 * fVar380 + fStack_7f0 * fVar400;
      auVar192._20_4_ = fStack_a0c * fVar293 + fStack_96c * fVar381 + fStack_7ec * fVar402;
      auVar192._24_4_ = fStack_a08 * fVar297 + fStack_968 * fVar382 + fStack_7e8 * fVar404;
      auVar192._28_4_ = fVar294 + fVar294 + auVar46._28_4_;
      auVar128 = vrcpps_avx(auVar192);
      fVar138 = auVar128._0_4_;
      fVar139 = auVar128._4_4_;
      auVar68._4_4_ = auVar192._4_4_ * fVar139;
      auVar68._0_4_ = auVar192._0_4_ * fVar138;
      fVar262 = auVar128._8_4_;
      auVar68._8_4_ = auVar192._8_4_ * fVar262;
      fVar278 = auVar128._12_4_;
      auVar68._12_4_ = auVar192._12_4_ * fVar278;
      fVar282 = auVar128._16_4_;
      auVar68._16_4_ = auVar192._16_4_ * fVar282;
      fVar286 = auVar128._20_4_;
      auVar68._20_4_ = auVar192._20_4_ * fVar286;
      fVar290 = auVar128._24_4_;
      auVar68._24_4_ = auVar192._24_4_ * fVar290;
      auVar68._28_4_ = fVar299;
      auVar330._8_4_ = 0x3f800000;
      auVar330._0_8_ = 0x3f8000003f800000;
      auVar330._12_4_ = 0x3f800000;
      auVar330._16_4_ = 0x3f800000;
      auVar330._20_4_ = 0x3f800000;
      auVar330._24_4_ = 0x3f800000;
      auVar330._28_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar330,auVar68);
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar128 = vandps_avx(auVar192,auVar307);
      auVar389._8_4_ = 0x219392ef;
      auVar389._0_8_ = 0x219392ef219392ef;
      auVar389._12_4_ = 0x219392ef;
      auVar389._16_4_ = 0x219392ef;
      auVar389._20_4_ = 0x219392ef;
      auVar389._24_4_ = 0x219392ef;
      auVar389._28_4_ = 0x219392ef;
      auVar41 = vcmpps_avx(auVar128,auVar389,1);
      auVar69._4_4_ =
           (fVar139 + fVar139 * auVar45._4_4_) *
           -(fVar277 * fVar276 + fVar377 * fVar275 + fVar394 * fVar259);
      auVar69._0_4_ =
           (fVar138 + fVar138 * auVar45._0_4_) *
           -(fVar261 * fVar238 + fVar372 * fVar227 + fVar383 * fVar226);
      auVar69._8_4_ =
           (fVar262 + fVar262 * auVar45._8_4_) *
           -(fVar281 * fVar295 + fVar378 * fVar292 + fVar396 * fVar291);
      auVar69._12_4_ =
           (fVar278 + fVar278 * auVar45._12_4_) *
           -(fVar285 * fVar320 + fVar379 * fVar318 + fVar398 * fVar316);
      auVar69._16_4_ =
           (fVar282 + fVar282 * auVar45._16_4_) *
           -(fVar289 * fVar361 + fVar380 * fVar360 + fVar400 * fVar350);
      auVar69._20_4_ =
           (fVar286 + fVar286 * auVar45._20_4_) *
           -(fVar293 * fVar26 + fVar381 * fVar25 + fVar402 * fVar24);
      auVar69._24_4_ =
           (fVar290 + fVar290 * auVar45._24_4_) *
           -(fVar297 * fVar34 + fVar382 * fVar33 + fVar404 * fVar32);
      auVar69._28_4_ = -(auVar46._28_4_ + auVar44._28_4_ + fVar294);
      auVar90 = ZEXT812(0);
      auVar128 = vcmpps_avx(auVar192,ZEXT1232(auVar90) << 0x20,1);
      auVar128 = vorps_avx(auVar41,auVar128);
      auVar355._8_4_ = 0xff800000;
      auVar355._0_8_ = 0xff800000ff800000;
      auVar355._12_4_ = 0xff800000;
      auVar355._16_4_ = 0xff800000;
      auVar355._20_4_ = 0xff800000;
      auVar355._24_4_ = 0xff800000;
      auVar355._28_4_ = 0xff800000;
      auVar356 = ZEXT3264(auVar355);
      auVar128 = vblendvps_avx(auVar69,auVar355,auVar128);
      auVar44 = vcmpps_avx(auVar192,ZEXT1232(auVar90) << 0x20,6);
      auVar41 = vorps_avx(auVar41,auVar44);
      auVar368._8_4_ = 0x7f800000;
      auVar368._0_8_ = 0x7f8000007f800000;
      auVar368._12_4_ = 0x7f800000;
      auVar368._16_4_ = 0x7f800000;
      auVar368._20_4_ = 0x7f800000;
      auVar368._24_4_ = 0x7f800000;
      auVar368._28_4_ = 0x7f800000;
      auVar370 = ZEXT3264(auVar368);
      auVar41 = vblendvps_avx(auVar69,auVar368,auVar41);
      auVar44 = vmaxps_avx(local_2e0,local_bc0);
      auVar44 = vmaxps_avx(auVar44,auVar128);
      auVar41 = vminps_avx(auVar390,auVar41);
      auVar390 = ZEXT1232(auVar90) << 0x20;
      auVar128 = vsubps_avx(auVar390,local_940);
      auVar39 = vsubps_avx(auVar390,auVar39);
      auVar70._4_4_ = auVar39._4_4_ * -fVar395;
      auVar70._0_4_ = auVar39._0_4_ * -fVar384;
      auVar70._8_4_ = auVar39._8_4_ * -fVar397;
      auVar70._12_4_ = auVar39._12_4_ * -fVar399;
      auVar70._16_4_ = auVar39._16_4_ * -fVar401;
      auVar70._20_4_ = auVar39._20_4_ * -fVar403;
      auVar70._24_4_ = auVar39._24_4_ * -fVar405;
      auVar70._28_4_ = auVar39._28_4_;
      auVar71._4_4_ = fVar256 * auVar128._4_4_;
      auVar71._0_4_ = fVar224 * auVar128._0_4_;
      auVar71._8_4_ = fVar287 * auVar128._8_4_;
      auVar71._12_4_ = fVar312 * auVar128._12_4_;
      auVar71._16_4_ = fVar344 * auVar128._16_4_;
      auVar71._20_4_ = fVar22 * auVar128._20_4_;
      auVar71._24_4_ = fVar30 * auVar128._24_4_;
      auVar71._28_4_ = auVar128._28_4_;
      auVar128 = vsubps_avx(auVar70,auVar71);
      auVar39 = vsubps_avx(auVar390,auVar391);
      auVar72._4_4_ = fVar257 * auVar39._4_4_;
      auVar72._0_4_ = fVar225 * auVar39._0_4_;
      auVar72._8_4_ = fVar288 * auVar39._8_4_;
      auVar72._12_4_ = fVar314 * auVar39._12_4_;
      auVar72._16_4_ = fVar347 * auVar39._16_4_;
      auVar72._20_4_ = fVar23 * auVar39._20_4_;
      uVar8 = auVar39._28_4_;
      auVar72._24_4_ = fVar31 * auVar39._24_4_;
      auVar72._28_4_ = uVar8;
      auVar391 = vsubps_avx(auVar128,auVar72);
      auVar73._4_4_ = (float)local_800._4_4_ * -fVar395;
      auVar73._0_4_ = (float)local_800._0_4_ * -fVar384;
      auVar73._8_4_ = fStack_7f8 * -fVar397;
      auVar73._12_4_ = fStack_7f4 * -fVar399;
      auVar73._16_4_ = fStack_7f0 * -fVar401;
      auVar73._20_4_ = fStack_7ec * -fVar403;
      auVar73._24_4_ = fStack_7e8 * -fVar405;
      auVar73._28_4_ = uVar103 ^ 0x80000000;
      auVar74._4_4_ = (float)local_980._4_4_ * fVar256;
      auVar74._0_4_ = (float)local_980._0_4_ * fVar224;
      auVar74._8_4_ = fStack_978 * fVar287;
      auVar74._12_4_ = fStack_974 * fVar312;
      auVar74._16_4_ = fStack_970 * fVar344;
      auVar74._20_4_ = fStack_96c * fVar22;
      auVar74._24_4_ = fStack_968 * fVar30;
      auVar74._28_4_ = uVar8;
      auVar128 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = fVar257 * (float)local_a20._4_4_;
      auVar75._0_4_ = fVar225 * (float)local_a20._0_4_;
      auVar75._8_4_ = fVar288 * fStack_a18;
      auVar75._12_4_ = fVar314 * fStack_a14;
      auVar75._16_4_ = fVar347 * fStack_a10;
      auVar75._20_4_ = fVar23 * fStack_a0c;
      auVar75._24_4_ = fVar31 * fStack_a08;
      auVar75._28_4_ = uVar8;
      auVar376 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar308 = ZEXT3264(auVar330);
      auVar45 = vsubps_avx(auVar128,auVar75);
      auVar128 = vrcpps_avx(auVar45);
      fVar224 = auVar128._0_4_;
      fVar225 = auVar128._4_4_;
      auVar76._4_4_ = auVar45._4_4_ * fVar225;
      auVar76._0_4_ = auVar45._0_4_ * fVar224;
      fVar226 = auVar128._8_4_;
      auVar76._8_4_ = auVar45._8_4_ * fVar226;
      fVar227 = auVar128._12_4_;
      auVar76._12_4_ = auVar45._12_4_ * fVar227;
      fVar238 = auVar128._16_4_;
      auVar76._16_4_ = auVar45._16_4_ * fVar238;
      fVar256 = auVar128._20_4_;
      auVar76._20_4_ = auVar45._20_4_ * fVar256;
      fVar257 = auVar128._24_4_;
      auVar76._24_4_ = auVar45._24_4_ * fVar257;
      auVar76._28_4_ = fStack_a04;
      auVar46 = vsubps_avx(auVar330,auVar76);
      auVar269._8_4_ = 0x7fffffff;
      auVar269._0_8_ = 0x7fffffff7fffffff;
      auVar269._12_4_ = 0x7fffffff;
      auVar269._16_4_ = 0x7fffffff;
      auVar269._20_4_ = 0x7fffffff;
      auVar269._24_4_ = 0x7fffffff;
      auVar269._28_4_ = 0x7fffffff;
      auVar128 = vandps_avx(auVar45,auVar269);
      auVar331._8_4_ = 0x219392ef;
      auVar331._0_8_ = 0x219392ef219392ef;
      auVar331._12_4_ = 0x219392ef;
      auVar331._16_4_ = 0x219392ef;
      auVar331._20_4_ = 0x219392ef;
      auVar331._24_4_ = 0x219392ef;
      auVar331._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar128,auVar331,1);
      auVar274 = ZEXT3264(auVar39);
      auVar77._4_4_ = (fVar225 + fVar225 * auVar46._4_4_) * -auVar391._4_4_;
      auVar77._0_4_ = (fVar224 + fVar224 * auVar46._0_4_) * -auVar391._0_4_;
      auVar77._8_4_ = (fVar226 + fVar226 * auVar46._8_4_) * -auVar391._8_4_;
      auVar77._12_4_ = (fVar227 + fVar227 * auVar46._12_4_) * -auVar391._12_4_;
      auVar77._16_4_ = (fVar238 + fVar238 * auVar46._16_4_) * -auVar391._16_4_;
      auVar77._20_4_ = (fVar256 + fVar256 * auVar46._20_4_) * -auVar391._20_4_;
      auVar77._24_4_ = (fVar257 + fVar257 * auVar46._24_4_) * -auVar391._24_4_;
      auVar77._28_4_ = auVar391._28_4_ ^ 0x80000000;
      auVar128 = vcmpps_avx(auVar45,auVar390,1);
      auVar128 = vorps_avx(auVar39,auVar128);
      auVar128 = vblendvps_avx(auVar77,auVar355,auVar128);
      _local_6a0 = vmaxps_avx(auVar44,auVar128);
      auVar391 = ZEXT1232(auVar90) << 0x20;
      auVar128 = vcmpps_avx(auVar45,auVar391,6);
      auVar128 = vorps_avx(auVar39,auVar128);
      auVar128 = vblendvps_avx(auVar77,auVar368,auVar128);
      auVar127 = vandps_avx(auVar127,local_500);
      local_360 = vminps_avx(auVar41,auVar128);
      auVar128 = vcmpps_avx(_local_6a0,local_360,2);
      auVar39 = auVar127 & auVar128;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar39 = vminps_avx(_local_a80,auVar129);
        auVar160 = vminps_avx(auVar160,auVar193);
        auVar39 = vminps_avx(auVar39,auVar160);
        auVar42 = vsubps_avx(auVar39,auVar42);
        auVar127 = vandps_avx(auVar128,auVar127);
        auVar98._4_4_ = fStack_2fc;
        auVar98._0_4_ = local_300;
        auVar98._8_4_ = fStack_2f8;
        auVar98._12_4_ = fStack_2f4;
        auVar98._16_4_ = fStack_2f0;
        auVar98._20_4_ = fStack_2ec;
        auVar98._24_4_ = fStack_2e8;
        auVar98._28_4_ = fStack_2e4;
        auVar128 = vminps_avx(auVar98,auVar330);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar173 + fVar145 * (auVar128._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar202 + fVar168 * (auVar128._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar203 + fVar170 * (auVar128._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar204 + fVar172 * (auVar128._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar173 + fVar145 * (auVar128._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar202 + fVar168 * (auVar128._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar203 + fVar170 * (auVar128._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar204 + auVar128._28_4_ + 7.0;
        auVar97._4_4_ = fStack_31c;
        auVar97._0_4_ = local_320;
        auVar97._8_4_ = fStack_318;
        auVar97._12_4_ = fStack_314;
        auVar97._16_4_ = fStack_310;
        auVar97._20_4_ = fStack_30c;
        auVar97._24_4_ = fStack_308;
        auVar97._28_4_ = fStack_304;
        auVar128 = vminps_avx(auVar97,auVar330);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar173 + fVar145 * (auVar128._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar202 + fVar168 * (auVar128._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar203 + fVar170 * (auVar128._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar204 + fVar172 * (auVar128._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar173 + fVar145 * (auVar128._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar202 + fVar168 * (auVar128._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar203 + fVar170 * (auVar128._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar204 + auVar128._28_4_ + 7.0;
        auVar78._4_4_ = auVar42._4_4_ * 0.99999976;
        auVar78._0_4_ = auVar42._0_4_ * 0.99999976;
        auVar78._8_4_ = auVar42._8_4_ * 0.99999976;
        auVar78._12_4_ = auVar42._12_4_ * 0.99999976;
        auVar78._16_4_ = auVar42._16_4_ * 0.99999976;
        auVar78._20_4_ = auVar42._20_4_ * 0.99999976;
        auVar78._24_4_ = auVar42._24_4_ * 0.99999976;
        auVar78._28_4_ = 0x3f7ffffc;
        auVar128 = vmaxps_avx(auVar391,auVar78);
        auVar79._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar79._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar79._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar79._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar79._16_4_ = auVar128._16_4_ * auVar128._16_4_;
        auVar79._20_4_ = auVar128._20_4_ * auVar128._20_4_;
        auVar79._24_4_ = auVar128._24_4_ * auVar128._24_4_;
        auVar79._28_4_ = auVar128._28_4_;
        local_900 = vsubps_avx(auVar47,auVar79);
        auVar80._4_4_ = local_900._4_4_ * fVar141 * 4.0;
        auVar80._0_4_ = local_900._0_4_ * fVar140 * 4.0;
        auVar80._8_4_ = local_900._8_4_ * fVar142 * 4.0;
        auVar80._12_4_ = local_900._12_4_ * fVar143 * 4.0;
        auVar80._16_4_ = local_900._16_4_ * fVar357 * 4.0;
        auVar80._20_4_ = local_900._20_4_ * fVar358 * 4.0;
        auVar80._24_4_ = local_900._24_4_ * fVar359 * 4.0;
        auVar80._28_4_ = auVar128._28_4_;
        auVar369 = vsubps_avx(auVar63,auVar80);
        auVar128 = vcmpps_avx(auVar369,ZEXT832(0) << 0x20,5);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar128[0x1f]) {
          auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          _local_860 = ZEXT832(0) << 0x20;
          auVar193 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar219 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar250._8_4_ = 0x7f800000;
          auVar250._0_8_ = 0x7f8000007f800000;
          auVar250._12_4_ = 0x7f800000;
          auVar250._16_4_ = 0x7f800000;
          auVar250._20_4_ = 0x7f800000;
          auVar250._24_4_ = 0x7f800000;
          auVar250._28_4_ = 0x7f800000;
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
          local_900 = auVar50;
          _local_820 = _local_840;
        }
        else {
          auVar39 = vsqrtps_avx(auVar369);
          auVar194._0_4_ = fVar140 + fVar140;
          auVar194._4_4_ = fVar141 + fVar141;
          auVar194._8_4_ = fVar142 + fVar142;
          auVar194._12_4_ = fVar143 + fVar143;
          auVar194._16_4_ = fVar357 + fVar357;
          auVar194._20_4_ = fVar358 + fVar358;
          auVar194._24_4_ = fVar359 + fVar359;
          auVar194._28_4_ = fVar146 + fVar146;
          auVar42 = vrcpps_avx(auVar194);
          fVar146 = auVar42._0_4_;
          fVar224 = auVar42._4_4_;
          auVar81._4_4_ = auVar194._4_4_ * fVar224;
          auVar81._0_4_ = auVar194._0_4_ * fVar146;
          fVar225 = auVar42._8_4_;
          auVar81._8_4_ = auVar194._8_4_ * fVar225;
          fVar226 = auVar42._12_4_;
          auVar81._12_4_ = auVar194._12_4_ * fVar226;
          fVar227 = auVar42._16_4_;
          auVar81._16_4_ = auVar194._16_4_ * fVar227;
          fVar238 = auVar42._20_4_;
          auVar81._20_4_ = auVar194._20_4_ * fVar238;
          fVar256 = auVar42._24_4_;
          auVar81._24_4_ = auVar194._24_4_ * fVar256;
          auVar81._28_4_ = auVar194._28_4_;
          auVar160 = vsubps_avx(auVar330,auVar81);
          fVar146 = fVar146 + fVar146 * auVar160._0_4_;
          fVar224 = fVar224 + fVar224 * auVar160._4_4_;
          fVar225 = fVar225 + fVar225 * auVar160._8_4_;
          fVar226 = fVar226 + fVar226 * auVar160._12_4_;
          fVar227 = fVar227 + fVar227 * auVar160._16_4_;
          fVar238 = fVar238 + fVar238 * auVar160._20_4_;
          fVar256 = fVar256 + fVar256 * auVar160._24_4_;
          fVar257 = auVar42._28_4_ + auVar160._28_4_;
          auVar221._0_8_ = local_960._0_8_ ^ 0x8000000080000000;
          auVar221._8_4_ = -local_960._8_4_;
          auVar221._12_4_ = -local_960._12_4_;
          auVar221._16_4_ = -local_960._16_4_;
          auVar221._20_4_ = -local_960._20_4_;
          auVar221._24_4_ = -local_960._24_4_;
          auVar221._28_4_ = -local_960._28_4_;
          auVar42 = vsubps_avx(auVar221,auVar39);
          fVar295 = auVar42._0_4_ * fVar146;
          fVar312 = auVar42._4_4_ * fVar224;
          auVar82._4_4_ = fVar312;
          auVar82._0_4_ = fVar295;
          fVar314 = auVar42._8_4_ * fVar225;
          auVar82._8_4_ = fVar314;
          fVar316 = auVar42._12_4_ * fVar226;
          auVar82._12_4_ = fVar316;
          fVar318 = auVar42._16_4_ * fVar227;
          auVar82._16_4_ = fVar318;
          fVar320 = auVar42._20_4_ * fVar238;
          auVar82._20_4_ = fVar320;
          fVar344 = auVar42._24_4_ * fVar256;
          auVar82._24_4_ = fVar344;
          auVar82._28_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar39,local_960);
          fVar146 = auVar39._0_4_ * fVar146;
          fVar224 = auVar39._4_4_ * fVar224;
          auVar83._4_4_ = fVar224;
          auVar83._0_4_ = fVar146;
          fVar225 = auVar39._8_4_ * fVar225;
          auVar83._8_4_ = fVar225;
          fVar226 = auVar39._12_4_ * fVar226;
          auVar83._12_4_ = fVar226;
          fVar227 = auVar39._16_4_ * fVar227;
          auVar83._16_4_ = fVar227;
          fVar238 = auVar39._20_4_ * fVar238;
          auVar83._20_4_ = fVar238;
          fVar256 = auVar39._24_4_ * fVar256;
          auVar83._24_4_ = fVar256;
          auVar83._28_4_ = 0x80000000;
          auVar376 = ZEXT3264(auVar83);
          fVar259 = (fVar295 * local_580 + (float)local_a00._0_4_) * fVar239;
          fVar275 = (fVar312 * fStack_57c + local_a00._4_4_) * fVar279;
          fVar276 = (fVar314 * fStack_578 + local_a00._8_4_) * fVar296;
          fVar287 = (fVar316 * fStack_574 + local_a00._12_4_) * fVar332;
          fVar288 = (fVar318 * fStack_570 + local_a00._16_4_) * fVar371;
          fVar291 = (fVar320 * fStack_56c + local_a00._20_4_) * fVar258;
          fVar292 = (fVar344 * fStack_568 + local_a00._24_4_) * fVar260;
          local_6e0._28_4_ = auVar43._28_4_;
          auVar161._0_4_ = fVar321 + fVar205 * fVar259;
          auVar161._4_4_ = fVar333 + fVar255 * fVar275;
          auVar161._8_4_ = fVar336 + fVar284 * fVar276;
          auVar161._12_4_ = fVar339 + fVar310 * fVar287;
          auVar161._16_4_ = fVar342 + fVar341 * fVar288;
          auVar161._20_4_ = fVar345 + fVar21 * fVar291;
          auVar161._24_4_ = fVar348 + fVar29 * fVar292;
          auVar161._28_4_ = fVar351 + auVar39._28_4_ + local_a00._28_4_;
          auVar84._4_4_ = (float)local_a20._4_4_ * fVar312;
          auVar84._0_4_ = (float)local_a20._0_4_ * fVar295;
          auVar84._8_4_ = fStack_a18 * fVar314;
          auVar84._12_4_ = fStack_a14 * fVar316;
          auVar84._16_4_ = fStack_a10 * fVar318;
          auVar84._20_4_ = fStack_a0c * fVar320;
          auVar84._24_4_ = fStack_a08 * fVar344;
          auVar84._28_4_ = fVar257;
          auVar160 = vsubps_avx(auVar84,auVar161);
          auVar195._0_4_ = fVar322 + fVar169 * fVar259;
          auVar195._4_4_ = fVar334 + fVar240 * fVar275;
          auVar195._8_4_ = fVar337 + fVar280 * fVar276;
          auVar195._12_4_ = fVar340 + fVar300 * fVar287;
          auVar195._16_4_ = fVar343 + fVar335 * fVar288;
          auVar195._20_4_ = fVar346 + fVar19 * fVar291;
          auVar195._24_4_ = fVar349 + fVar27 * fVar292;
          auVar195._28_4_ = fVar352 + fVar257;
          auVar251._0_4_ = (float)local_980._0_4_ * fVar295;
          auVar251._4_4_ = (float)local_980._4_4_ * fVar312;
          auVar251._8_4_ = fStack_978 * fVar314;
          auVar251._12_4_ = fStack_974 * fVar316;
          auVar251._16_4_ = fStack_970 * fVar318;
          auVar251._20_4_ = fStack_96c * fVar320;
          auVar251._24_4_ = fStack_968 * fVar344;
          auVar251._28_4_ = 0;
          auVar193 = vsubps_avx(auVar251,auVar195);
          auVar222._0_4_ = local_920 + fVar171 * fVar259;
          auVar222._4_4_ = fStack_91c + fVar241 * fVar275;
          auVar222._8_4_ = fStack_918 + fVar283 * fVar276;
          auVar222._12_4_ = fStack_914 + fVar309 * fVar287;
          auVar222._16_4_ = fStack_910 + fVar338 * fVar288;
          auVar222._20_4_ = fStack_90c + fVar20 * fVar291;
          auVar222._24_4_ = fStack_908 + fVar28 * fVar292;
          auVar222._28_4_ = fStack_904 + auVar42._28_4_;
          auVar85._4_4_ = (float)local_800._4_4_ * fVar312;
          auVar85._0_4_ = (float)local_800._0_4_ * fVar295;
          auVar85._8_4_ = fStack_7f8 * fVar314;
          auVar85._12_4_ = fStack_7f4 * fVar316;
          auVar85._16_4_ = fStack_7f0 * fVar318;
          auVar85._20_4_ = fStack_7ec * fVar320;
          auVar85._24_4_ = fStack_7e8 * fVar344;
          auVar85._28_4_ = 0;
          auVar42 = vsubps_avx(auVar85,auVar222);
          auVar219 = auVar42._0_28_;
          fVar239 = (fVar146 * local_580 + (float)local_a00._0_4_) * fVar239;
          fVar279 = (fVar224 * fStack_57c + local_a00._4_4_) * fVar279;
          fVar296 = (fVar225 * fStack_578 + local_a00._8_4_) * fVar296;
          fVar332 = (fVar226 * fStack_574 + local_a00._12_4_) * fVar332;
          fVar371 = (fVar227 * fStack_570 + local_a00._16_4_) * fVar371;
          fVar258 = (fVar238 * fStack_56c + local_a00._20_4_) * fVar258;
          fVar260 = (fVar256 * fStack_568 + local_a00._24_4_) * fVar260;
          auVar271._0_4_ = fVar321 + fVar205 * fVar239;
          auVar271._4_4_ = fVar333 + fVar255 * fVar279;
          auVar271._8_4_ = fVar336 + fVar284 * fVar296;
          auVar271._12_4_ = fVar339 + fVar310 * fVar332;
          auVar271._16_4_ = fVar342 + fVar341 * fVar371;
          auVar271._20_4_ = fVar345 + fVar21 * fVar258;
          auVar271._24_4_ = fVar348 + fVar29 * fVar260;
          auVar271._28_4_ = fVar351 + (float)local_6e0._28_4_;
          auVar86._4_4_ = (float)local_a20._4_4_ * fVar224;
          auVar86._0_4_ = (float)local_a20._0_4_ * fVar146;
          auVar86._8_4_ = fStack_a18 * fVar225;
          auVar86._12_4_ = fStack_a14 * fVar226;
          auVar86._16_4_ = fStack_a10 * fVar227;
          auVar86._20_4_ = fStack_a0c * fVar238;
          auVar86._24_4_ = fStack_a08 * fVar256;
          auVar86._28_4_ = fStack_a04;
          _local_820 = vsubps_avx(auVar86,auVar271);
          auVar272._0_4_ = fVar322 + fVar169 * fVar239;
          auVar272._4_4_ = fVar334 + fVar240 * fVar279;
          auVar272._8_4_ = fVar337 + fVar280 * fVar296;
          auVar272._12_4_ = fVar340 + fVar300 * fVar332;
          auVar272._16_4_ = fVar343 + fVar335 * fVar371;
          auVar272._20_4_ = fVar346 + fVar19 * fVar258;
          auVar272._24_4_ = fVar349 + fVar27 * fVar260;
          auVar272._28_4_ = fVar352 + local_820._28_4_;
          auVar87._4_4_ = (float)local_980._4_4_ * fVar224;
          auVar87._0_4_ = (float)local_980._0_4_ * fVar146;
          auVar87._8_4_ = fStack_978 * fVar225;
          auVar87._12_4_ = fStack_974 * fVar226;
          auVar87._16_4_ = fStack_970 * fVar227;
          auVar87._20_4_ = fStack_96c * fVar238;
          auVar87._24_4_ = fStack_968 * fVar256;
          auVar87._28_4_ = fStack_a04;
          _local_840 = vsubps_avx(auVar87,auVar272);
          auVar252._0_4_ = local_920 + fVar171 * fVar239;
          auVar252._4_4_ = fStack_91c + fVar241 * fVar279;
          auVar252._8_4_ = fStack_918 + fVar283 * fVar296;
          auVar252._12_4_ = fStack_914 + fVar309 * fVar332;
          auVar252._16_4_ = fStack_910 + fVar338 * fVar371;
          auVar252._20_4_ = fStack_90c + fVar20 * fVar258;
          auVar252._24_4_ = fStack_908 + fVar28 * fVar260;
          auVar252._28_4_ = fStack_904 + local_a00._28_4_ + 0.0;
          auVar88._4_4_ = (float)local_800._4_4_ * fVar224;
          auVar88._0_4_ = (float)local_800._0_4_ * fVar146;
          auVar88._8_4_ = fStack_7f8 * fVar225;
          auVar88._12_4_ = fStack_7f4 * fVar226;
          auVar88._16_4_ = fStack_7f0 * fVar227;
          auVar88._20_4_ = fStack_7ec * fVar238;
          auVar88._24_4_ = fStack_7e8 * fVar256;
          auVar88._28_4_ = local_840._28_4_;
          _local_860 = vsubps_avx(auVar88,auVar252);
          auVar39 = vcmpps_avx(auVar369,auVar391,5);
          auVar253._8_4_ = 0x7f800000;
          auVar253._0_8_ = 0x7f8000007f800000;
          auVar253._12_4_ = 0x7f800000;
          auVar253._16_4_ = 0x7f800000;
          auVar253._20_4_ = 0x7f800000;
          auVar253._24_4_ = 0x7f800000;
          auVar253._28_4_ = 0x7f800000;
          auVar250 = vblendvps_avx(auVar253,auVar82,auVar39);
          auVar363._8_4_ = 0x7fffffff;
          auVar363._0_8_ = 0x7fffffff7fffffff;
          auVar363._12_4_ = 0x7fffffff;
          auVar363._16_4_ = 0x7fffffff;
          auVar363._20_4_ = 0x7fffffff;
          auVar363._24_4_ = 0x7fffffff;
          auVar363._28_4_ = 0x7fffffff;
          auVar42 = vandps_avx(auVar363,local_340);
          auVar42 = vmaxps_avx(local_520,auVar42);
          auVar369._8_4_ = 0x36000000;
          auVar369._0_8_ = 0x3600000036000000;
          auVar369._12_4_ = 0x36000000;
          auVar369._16_4_ = 0x36000000;
          auVar369._20_4_ = 0x36000000;
          auVar369._24_4_ = 0x36000000;
          auVar369._28_4_ = 0x36000000;
          auVar89._4_4_ = auVar42._4_4_ * 1.9073486e-06;
          auVar89._0_4_ = auVar42._0_4_ * 1.9073486e-06;
          auVar89._8_4_ = auVar42._8_4_ * 1.9073486e-06;
          auVar89._12_4_ = auVar42._12_4_ * 1.9073486e-06;
          auVar89._16_4_ = auVar42._16_4_ * 1.9073486e-06;
          auVar89._20_4_ = auVar42._20_4_ * 1.9073486e-06;
          auVar89._24_4_ = auVar42._24_4_ * 1.9073486e-06;
          auVar89._28_4_ = auVar42._28_4_;
          auVar42 = vandps_avx(auVar363,local_560);
          auVar42 = vcmpps_avx(auVar42,auVar89,1);
          auVar273._8_4_ = 0xff800000;
          auVar273._0_8_ = 0xff800000ff800000;
          auVar273._12_4_ = 0xff800000;
          auVar273._16_4_ = 0xff800000;
          auVar273._20_4_ = 0xff800000;
          auVar273._24_4_ = 0xff800000;
          auVar273._28_4_ = 0xff800000;
          auVar270 = vblendvps_avx(auVar273,auVar83,auVar39);
          auVar391 = auVar39 & auVar42;
          local_940 = auVar193;
          if ((((((((auVar391 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar391 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar391 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar391 >> 0x7f,0) != '\0') ||
                (auVar391 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar391 >> 0xbf,0) != '\0') ||
              (auVar391 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar391[0x1f] < '\0') {
            auVar128 = vandps_avx(auVar42,auVar39);
            auVar188 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
            auVar391 = vcmpps_avx(local_900,ZEXT832(0) << 0x20,2);
            auVar408._8_4_ = 0xff800000;
            auVar408._0_8_ = 0xff800000ff800000;
            auVar408._12_4_ = 0xff800000;
            auVar408._16_4_ = 0xff800000;
            auVar408._20_4_ = 0xff800000;
            auVar408._24_4_ = 0xff800000;
            auVar408._28_4_ = 0xff800000;
            auVar393._8_4_ = 0x7f800000;
            auVar393._0_8_ = 0x7f8000007f800000;
            auVar393._12_4_ = 0x7f800000;
            auVar393._16_4_ = 0x7f800000;
            auVar393._20_4_ = 0x7f800000;
            auVar393._24_4_ = 0x7f800000;
            auVar393._28_4_ = 0x7f800000;
            auVar42 = vblendvps_avx(auVar393,auVar408,auVar391);
            auVar184 = vpmovsxwd_avx(auVar188);
            auVar376 = ZEXT1664(auVar184);
            auVar188 = vpunpckhwd_avx(auVar188,auVar188);
            auVar364._16_16_ = auVar188;
            auVar364._0_16_ = auVar184;
            auVar250 = vblendvps_avx(auVar250,auVar42,auVar364);
            auVar369 = vblendvps_avx(auVar408,auVar393,auVar391);
            auVar270 = vblendvps_avx(auVar270,auVar369,auVar364);
            auVar42 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar137._0_4_ = auVar42._0_4_ ^ auVar128._0_4_;
            auVar137._4_4_ = auVar42._4_4_ ^ auVar128._4_4_;
            auVar137._8_4_ = auVar42._8_4_ ^ auVar128._8_4_;
            auVar137._12_4_ = auVar42._12_4_ ^ auVar128._12_4_;
            auVar137._16_4_ = auVar42._16_4_ ^ auVar128._16_4_;
            auVar137._20_4_ = auVar42._20_4_ ^ auVar128._20_4_;
            auVar137._24_4_ = auVar42._24_4_ ^ auVar128._24_4_;
            auVar137._28_4_ = auVar42._28_4_ ^ auVar128._28_4_;
            auVar128 = vorps_avx(auVar391,auVar137);
            auVar128 = vandps_avx(auVar39,auVar128);
          }
        }
        auVar370 = ZEXT3264(auVar369);
        auVar365 = ZEXT3264(auVar127);
        auVar356 = ZEXT1664(local_8a0);
        _local_3c0 = _local_6a0;
        local_3a0 = vminps_avx(local_360,auVar250);
        _local_6c0 = vmaxps_avx(_local_6a0,auVar270);
        auVar274 = ZEXT3264(_local_6c0);
        local_380 = _local_6c0;
        auVar42 = vcmpps_avx(_local_6a0,local_3a0,2);
        local_5e0 = vandps_avx(auVar127,auVar42);
        auVar42 = vcmpps_avx(_local_6c0,local_360,2);
        local_620 = vandps_avx(auVar127,auVar42);
        auVar308 = ZEXT3264(local_620);
        auVar127 = vorps_avx(local_620,local_5e0);
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0x7f,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar127 >> 0xbf,0) != '\0') ||
            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar127[0x1f] < '\0') {
          local_6e0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_640._0_4_ = auVar128._0_4_ ^ local_6e0._0_4_;
          local_640._4_4_ = auVar128._4_4_ ^ local_6e0._4_4_;
          local_640._8_4_ = auVar128._8_4_ ^ local_6e0._8_4_;
          local_640._12_4_ = auVar128._12_4_ ^ local_6e0._12_4_;
          local_640._16_4_ = auVar128._16_4_ ^ local_6e0._16_4_;
          local_640._20_4_ = auVar128._20_4_ ^ local_6e0._20_4_;
          local_640._24_4_ = auVar128._24_4_ ^ local_6e0._24_4_;
          local_640._28_4_ = (uint)auVar128._28_4_ ^ local_6e0._28_4_;
          auVar274 = ZEXT3264(_local_980);
          auVar130._0_4_ =
               (float)local_a20._0_4_ * auVar160._0_4_ +
               (float)local_980._0_4_ * auVar193._0_4_ + (float)local_800._0_4_ * auVar219._0_4_;
          auVar130._4_4_ =
               (float)local_a20._4_4_ * auVar160._4_4_ +
               (float)local_980._4_4_ * auVar193._4_4_ + (float)local_800._4_4_ * auVar219._4_4_;
          auVar130._8_4_ =
               fStack_a18 * auVar160._8_4_ +
               fStack_978 * auVar193._8_4_ + fStack_7f8 * auVar219._8_4_;
          auVar130._12_4_ =
               fStack_a14 * auVar160._12_4_ +
               fStack_974 * auVar193._12_4_ + fStack_7f4 * auVar219._12_4_;
          auVar130._16_4_ =
               fStack_a10 * auVar160._16_4_ +
               fStack_970 * auVar193._16_4_ + fStack_7f0 * auVar219._16_4_;
          auVar130._20_4_ =
               fStack_a0c * auVar160._20_4_ +
               fStack_96c * auVar193._20_4_ + fStack_7ec * auVar219._20_4_;
          auVar130._24_4_ =
               fStack_a08 * auVar160._24_4_ +
               fStack_968 * auVar193._24_4_ + fStack_7e8 * auVar219._24_4_;
          auVar130._28_4_ = auVar128._28_4_ + auVar160._28_4_ + auVar193._28_4_;
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar162._16_4_ = 0x7fffffff;
          auVar162._20_4_ = 0x7fffffff;
          auVar162._24_4_ = 0x7fffffff;
          auVar162._28_4_ = 0x7fffffff;
          auVar127 = vandps_avx(auVar130,auVar162);
          auVar163._8_4_ = 0x3e99999a;
          auVar163._0_8_ = 0x3e99999a3e99999a;
          auVar163._12_4_ = 0x3e99999a;
          auVar163._16_4_ = 0x3e99999a;
          auVar163._20_4_ = 0x3e99999a;
          auVar163._24_4_ = 0x3e99999a;
          auVar163._28_4_ = 0x3e99999a;
          auVar127 = vcmpps_avx(auVar127,auVar163,1);
          auVar127 = vorps_avx(local_640,auVar127);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar127 = vblendvps_avx(auVar196,auVar164,auVar127);
          local_660 = ZEXT432(local_bc8);
          local_680 = vpshufd_avx(ZEXT416(local_bc8),0);
          fVar146 = 0.0;
          auVar188 = vpcmpgtd_avx(auVar127._16_16_,local_680);
          auStack_670 = auVar40._16_16_;
          auVar184 = vpcmpgtd_avx(auVar127._0_16_,local_680);
          auVar165._16_16_ = auVar188;
          auVar165._0_16_ = auVar184;
          local_600 = vblendps_avx(ZEXT1632(auVar184),auVar165,0xf0);
          local_5c0 = vandnps_avx(local_600,local_5e0);
          auVar308 = ZEXT3264(local_5c0);
          auVar127 = local_5e0 & ~local_600;
          local_ac0 = auVar38._0_4_;
          fStack_abc = auVar38._4_4_;
          fStack_ab8 = auVar38._8_4_;
          fStack_ab4 = auVar38._12_4_;
          local_aa0 = auVar36._0_4_;
          fStack_a9c = auVar36._4_4_;
          fStack_a98 = auVar36._8_4_;
          fStack_a94 = auVar36._12_4_;
          local_ab0 = auVar37._0_4_;
          fStack_aac = auVar37._4_4_;
          fStack_aa8 = auVar37._8_4_;
          fStack_aa4 = auVar37._12_4_;
          local_a90 = auVar35._0_4_;
          fStack_a8c = auVar35._4_4_;
          fStack_a88 = auVar35._8_4_;
          fStack_a84 = auVar35._12_4_;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0x7f,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar127 >> 0xbf,0) == '\0') &&
              (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar127[0x1f]) {
            auVar188 = vshufps_avx(local_8a0,local_8a0,0);
            auVar131._16_16_ = auVar188;
            auVar131._0_16_ = auVar188;
            fVar205 = (float)local_a20._0_4_;
            fVar224 = (float)local_a20._4_4_;
            fVar225 = fStack_a18;
            fVar226 = fStack_a14;
            fVar227 = fStack_a10;
            fVar238 = fStack_a0c;
            fVar239 = fStack_a08;
          }
          else {
            local_9a0._4_4_ = (float)local_6a0._4_4_ + (float)local_8e0._4_4_;
            local_9a0._0_4_ = (float)local_6a0._0_4_ + (float)local_8e0._0_4_;
            fStack_998 = fStack_698 + fStack_8d8;
            fStack_994 = fStack_694 + fStack_8d4;
            fStack_990 = fStack_690 + fStack_8d0;
            fStack_98c = fStack_68c + fStack_8cc;
            fStack_988 = fStack_688 + fStack_8c8;
            fStack_984 = fStack_684 + fStack_8c4;
            do {
              auVar132._8_4_ = 0x7f800000;
              auVar132._0_8_ = 0x7f8000007f800000;
              auVar132._12_4_ = 0x7f800000;
              auVar132._16_4_ = 0x7f800000;
              auVar132._20_4_ = 0x7f800000;
              auVar132._24_4_ = 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar127 = auVar308._0_32_;
              auVar128 = vblendvps_avx(auVar132,_local_6a0,auVar127);
              auVar42 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar42 = vminps_avx(auVar128,auVar42);
              auVar39 = vshufpd_avx(auVar42,auVar42,5);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar39 = vperm2f128_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar128 = vcmpps_avx(auVar128,auVar42,0);
              auVar42 = auVar127 & auVar128;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar128,auVar127);
              }
              uVar100 = vmovmskps_avx(auVar127);
              uVar103 = 0;
              if (uVar100 != 0) {
                for (; (uVar100 >> uVar103 & 1) == 0; uVar103 = uVar103 + 1) {
                }
              }
              uVar101 = (ulong)uVar103;
              *(undefined4 *)(local_5c0 + uVar101 * 4) = 0;
              fVar146 = local_1a0[uVar101];
              uVar103 = *(uint *)(local_3c0 + uVar101 * 4);
              fVar169 = auVar151._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar169 = sqrtf((float)local_9c0._0_4_);
              }
              auVar184 = vminps_avx(auVar35,auVar37);
              auVar188 = vmaxps_avx(auVar35,auVar37);
              auVar121 = vminps_avx(auVar36,auVar38);
              auVar155 = vminps_avx(auVar184,auVar121);
              auVar184 = vmaxps_avx(auVar36,auVar38);
              auVar121 = vmaxps_avx(auVar188,auVar184);
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar188 = vandps_avx(auVar155,auVar209);
              auVar184 = vandps_avx(auVar121,auVar209);
              auVar188 = vmaxps_avx(auVar188,auVar184);
              auVar184 = vmovshdup_avx(auVar188);
              auVar184 = vmaxss_avx(auVar184,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar184);
              fVar171 = auVar188._0_4_ * 1.9073486e-06;
              local_900._0_4_ = fVar169 * 1.9073486e-06;
              local_960._0_16_ = vshufps_avx(auVar121,auVar121,0xff);
              auVar188 = vinsertps_avx(ZEXT416(uVar103),ZEXT416((uint)fVar146),0x10);
              auVar356 = ZEXT1664(auVar188);
              bVar109 = true;
              uVar101 = 0;
              do {
                auVar354 = auVar356._0_16_;
                auVar188 = vmovshdup_avx(auVar354);
                fVar146 = auVar188._0_4_;
                fVar225 = 1.0 - fVar146;
                fVar169 = fVar225 * fVar225 * fVar225;
                fVar205 = fVar146 * fVar146 * fVar146;
                fVar224 = fVar146 * fVar225;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar205 * 0.16666667)),
                                       ZEXT416((uint)(fVar205 * 0.16666667)),0);
                auVar184 = ZEXT416((uint)((fVar205 * 4.0 + fVar169 +
                                          fVar146 * fVar224 * 12.0 + fVar225 * fVar224 * 6.0) *
                                         0.16666667));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar121 = ZEXT416((uint)((fVar169 * 4.0 + fVar205 +
                                          fVar225 * fVar224 * 12.0 + fVar146 * fVar224 * 6.0) *
                                         0.16666667));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar155 = vshufps_avx(auVar354,auVar354,0);
                auVar178._0_4_ = auVar155._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar178._4_4_ = auVar155._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar178._8_4_ = auVar155._8_4_ * fStack_9a8 + 0.0;
                auVar178._12_4_ = auVar155._12_4_ * fStack_9a4 + 0.0;
                auVar155 = vshufps_avx(ZEXT416((uint)(fVar169 * 0.16666667)),
                                       ZEXT416((uint)(fVar169 * 0.16666667)),0);
                auVar115._0_4_ =
                     auVar155._0_4_ * local_a90 +
                     auVar121._0_4_ * local_ab0 +
                     auVar188._0_4_ * local_ac0 + auVar184._0_4_ * local_aa0;
                auVar115._4_4_ =
                     auVar155._4_4_ * fStack_a8c +
                     auVar121._4_4_ * fStack_aac +
                     auVar188._4_4_ * fStack_abc + auVar184._4_4_ * fStack_a9c;
                auVar115._8_4_ =
                     auVar155._8_4_ * fStack_a88 +
                     auVar121._8_4_ * fStack_aa8 +
                     auVar188._8_4_ * fStack_ab8 + auVar184._8_4_ * fStack_a98;
                auVar115._12_4_ =
                     auVar155._12_4_ * fStack_a84 +
                     auVar121._12_4_ * fStack_aa4 +
                     auVar188._12_4_ * fStack_ab4 + auVar184._12_4_ * fStack_a94;
                local_940._0_16_ = auVar115;
                auVar188 = vsubps_avx(auVar178,auVar115);
                local_920 = auVar188._0_4_;
                fStack_91c = auVar188._4_4_;
                fStack_918 = auVar188._8_4_;
                fStack_914 = auVar188._12_4_;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                fVar169 = auVar188._0_4_;
                local_ba0 = auVar356._0_4_;
                if (fVar169 < 0.0) {
                  fVar205 = sqrtf(fVar169);
                }
                else {
                  auVar184 = vsqrtss_avx(auVar188,auVar188);
                  fVar205 = auVar184._0_4_;
                }
                auVar184 = ZEXT416((uint)(fVar146 * fVar146 * 0.5));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar121 = ZEXT416((uint)((fVar225 * fVar225 + fVar224 * 4.0) * 0.5));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar155 = ZEXT416((uint)((fVar146 * -fVar146 - fVar224 * 4.0) * 0.5));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar120 = ZEXT416((uint)(fVar225 * -fVar225 * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar326._0_4_ =
                     local_a90 * auVar120._0_4_ +
                     local_ab0 * auVar155._0_4_ +
                     local_ac0 * auVar184._0_4_ + local_aa0 * auVar121._0_4_;
                auVar326._4_4_ =
                     fStack_a8c * auVar120._4_4_ +
                     fStack_aac * auVar155._4_4_ +
                     fStack_abc * auVar184._4_4_ + fStack_a9c * auVar121._4_4_;
                auVar326._8_4_ =
                     fStack_a88 * auVar120._8_4_ +
                     fStack_aa8 * auVar155._8_4_ +
                     fStack_ab8 * auVar184._8_4_ + fStack_a98 * auVar121._8_4_;
                auVar326._12_4_ =
                     fStack_a84 * auVar120._12_4_ +
                     fStack_aa4 * auVar155._12_4_ +
                     fStack_ab4 * auVar184._12_4_ + fStack_a94 * auVar121._12_4_;
                auVar184 = vshufps_avx(auVar354,auVar354,0x55);
                auVar121 = ZEXT416((uint)(fVar225 - (fVar146 + fVar146)));
                auVar155 = vshufps_avx(auVar121,auVar121,0);
                auVar121 = ZEXT416((uint)(fVar146 - (fVar225 + fVar225)));
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar111 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
                auVar121 = vdpps_avx(auVar326,auVar326,0x7f);
                auVar152._0_4_ =
                     local_a90 * auVar111._0_4_ +
                     local_ab0 * auVar120._0_4_ +
                     local_ac0 * auVar184._0_4_ + local_aa0 * auVar155._0_4_;
                auVar152._4_4_ =
                     fStack_a8c * auVar111._4_4_ +
                     fStack_aac * auVar120._4_4_ +
                     fStack_abc * auVar184._4_4_ + fStack_a9c * auVar155._4_4_;
                auVar152._8_4_ =
                     fStack_a88 * auVar111._8_4_ +
                     fStack_aa8 * auVar120._8_4_ +
                     fStack_ab8 * auVar184._8_4_ + fStack_a98 * auVar155._8_4_;
                auVar152._12_4_ =
                     fStack_a84 * auVar111._12_4_ +
                     fStack_aa4 * auVar120._12_4_ +
                     fStack_ab4 * auVar184._12_4_ + fStack_a94 * auVar155._12_4_;
                auVar184 = vblendps_avx(auVar121,_DAT_01f7aa10,0xe);
                auVar155 = vrsqrtss_avx(auVar184,auVar184);
                fVar224 = auVar155._0_4_;
                fVar146 = auVar121._0_4_;
                auVar155 = vdpps_avx(auVar326,auVar152,0x7f);
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar153._0_4_ = auVar152._0_4_ * auVar120._0_4_;
                auVar153._4_4_ = auVar152._4_4_ * auVar120._4_4_;
                auVar153._8_4_ = auVar152._8_4_ * auVar120._8_4_;
                auVar153._12_4_ = auVar152._12_4_ * auVar120._12_4_;
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar231._0_4_ = auVar326._0_4_ * auVar155._0_4_;
                auVar231._4_4_ = auVar326._4_4_ * auVar155._4_4_;
                auVar231._8_4_ = auVar326._8_4_ * auVar155._8_4_;
                auVar231._12_4_ = auVar326._12_4_ * auVar155._12_4_;
                auVar111 = vsubps_avx(auVar153,auVar231);
                auVar155 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)fVar171),
                                      ZEXT416((uint)(local_ba0 * (float)local_900._0_4_)));
                auVar365 = ZEXT1664(auVar184);
                auVar155 = ZEXT416((uint)(auVar155._0_4_ * (2.0 - fVar146 * auVar155._0_4_)));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                uVar91 = CONCAT44(auVar326._4_4_,auVar326._0_4_);
                auVar244._0_8_ = uVar91 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar326._8_4_;
                auVar244._12_4_ = -auVar326._12_4_;
                auVar120 = ZEXT416((uint)(fVar224 * 1.5 +
                                         fVar146 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar210._0_4_ = auVar120._0_4_ * auVar111._0_4_ * auVar155._0_4_;
                auVar210._4_4_ = auVar120._4_4_ * auVar111._4_4_ * auVar155._4_4_;
                auVar210._8_4_ = auVar120._8_4_ * auVar111._8_4_ * auVar155._8_4_;
                auVar210._12_4_ = auVar120._12_4_ * auVar111._12_4_ * auVar155._12_4_;
                auVar265._0_4_ = auVar326._0_4_ * auVar120._0_4_;
                auVar265._4_4_ = auVar326._4_4_ * auVar120._4_4_;
                auVar265._8_4_ = auVar326._8_4_ * auVar120._8_4_;
                auVar265._12_4_ = auVar326._12_4_ * auVar120._12_4_;
                if (fVar146 < 0.0) {
                  local_9e0._0_16_ = auVar210;
                  fVar146 = sqrtf(fVar146);
                  auVar365 = ZEXT464(auVar184._0_4_);
                  auVar210 = local_9e0._0_16_;
                }
                else {
                  auVar121 = vsqrtss_avx(auVar121,auVar121);
                  fVar146 = auVar121._0_4_;
                }
                auVar94._4_4_ = fStack_91c;
                auVar94._0_4_ = local_920;
                auVar94._8_4_ = fStack_918;
                auVar94._12_4_ = fStack_914;
                auVar121 = vdpps_avx(auVar94,auVar265,0x7f);
                fVar146 = (fVar171 / fVar146) * (fVar205 + 1.0) + auVar365._0_4_ + fVar205 * fVar171
                ;
                auVar155 = vdpps_avx(auVar244,auVar265,0x7f);
                auVar120 = vdpps_avx(auVar94,auVar210,0x7f);
                auVar111 = vdpps_avx(_local_9b0,auVar265,0x7f);
                auVar112 = vdpps_avx(auVar94,auVar244,0x7f);
                fVar205 = auVar155._0_4_ + auVar120._0_4_;
                fVar224 = auVar121._0_4_;
                auVar116._0_4_ = fVar224 * fVar224;
                auVar116._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar116._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar116._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar120 = vsubps_avx(auVar188,auVar116);
                auVar155 = vdpps_avx(auVar94,_local_9b0,0x7f);
                fVar225 = auVar112._0_4_ - fVar224 * fVar205;
                fVar226 = auVar155._0_4_ - fVar224 * auVar111._0_4_;
                auVar155 = vrsqrtss_avx(auVar120,auVar120);
                fVar227 = auVar120._0_4_;
                fVar224 = auVar155._0_4_;
                fVar224 = fVar224 * 1.5 + fVar227 * -0.5 * fVar224 * fVar224 * fVar224;
                if (fVar227 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar205);
                  local_7c0._0_4_ = fVar225;
                  local_7e0._0_4_ = fVar226;
                  local_a00._0_4_ = fVar224;
                  fVar227 = sqrtf(fVar227);
                  auVar365 = ZEXT464(auVar184._0_4_);
                  fVar224 = (float)local_a00._0_4_;
                  fVar225 = (float)local_7c0._0_4_;
                  fVar226 = (float)local_7e0._0_4_;
                  auVar184 = local_9e0._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar120,auVar120);
                  fVar227 = auVar184._0_4_;
                  auVar184 = ZEXT416((uint)fVar205);
                }
                auVar376 = ZEXT1664(auVar121);
                auVar370 = ZEXT464((uint)fVar146);
                auVar113 = vpermilps_avx(local_940._0_16_,0xff);
                auVar112 = vshufps_avx(auVar326,auVar326,0xff);
                fVar205 = fVar225 * fVar224 - auVar112._0_4_;
                auVar232._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar232._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar232._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar245._0_4_ = -fVar205;
                auVar245._4_4_ = 0x80000000;
                auVar245._8_4_ = 0x80000000;
                auVar245._12_4_ = 0x80000000;
                auVar155 = vinsertps_avx(auVar245,ZEXT416((uint)(fVar226 * fVar224)),0x1c);
                auVar120 = vmovsldup_avx(ZEXT416((uint)(auVar184._0_4_ * fVar226 * fVar224 -
                                                       auVar111._0_4_ * fVar205)));
                auVar155 = vdivps_avx(auVar155,auVar120);
                auVar184 = vinsertps_avx(auVar184,auVar232,0x10);
                auVar184 = vdivps_avx(auVar184,auVar120);
                auVar120 = vmovsldup_avx(auVar121);
                auVar113 = ZEXT416((uint)(fVar227 - auVar113._0_4_));
                auVar111 = vmovsldup_avx(auVar113);
                auVar179._0_4_ = auVar120._0_4_ * auVar155._0_4_ + auVar111._0_4_ * auVar184._0_4_;
                auVar179._4_4_ = auVar120._4_4_ * auVar155._4_4_ + auVar111._4_4_ * auVar184._4_4_;
                auVar179._8_4_ = auVar120._8_4_ * auVar155._8_4_ + auVar111._8_4_ * auVar184._8_4_;
                auVar179._12_4_ =
                     auVar120._12_4_ * auVar155._12_4_ + auVar111._12_4_ * auVar184._12_4_;
                auVar155 = vsubps_avx(auVar354,auVar179);
                auVar356 = ZEXT1664(auVar155);
                auVar180._8_4_ = 0x7fffffff;
                auVar180._0_8_ = 0x7fffffff7fffffff;
                auVar180._12_4_ = 0x7fffffff;
                auVar184 = vandps_avx(auVar121,auVar180);
                fVar205 = (float)local_a20._0_4_;
                fVar224 = (float)local_a20._4_4_;
                fVar225 = fStack_a18;
                fVar226 = fStack_a14;
                fVar227 = fStack_a10;
                fVar238 = fStack_a0c;
                fVar239 = fStack_a08;
                if (auVar184._0_4_ < fVar146) {
                  auVar211._8_4_ = 0x7fffffff;
                  auVar211._0_8_ = 0x7fffffff7fffffff;
                  auVar211._12_4_ = 0x7fffffff;
                  auVar184 = vandps_avx(auVar113,auVar211);
                  if (auVar184._0_4_ <
                      (float)local_960._0_4_ * 1.9073486e-06 + auVar365._0_4_ + fVar146) {
                    fVar171 = auVar155._0_4_ + (float)local_890._0_4_;
                    auVar274 = ZEXT3264(_local_980);
                    if (fVar171 < fVar144) {
                      bVar110 = 0;
                    }
                    else {
                      fVar240 = *(float *)(ray + k * 4 + 0x80);
                      auVar365 = ZEXT464((uint)fVar240);
                      if (fVar240 < fVar171) {
                        bVar110 = 0;
                      }
                      else {
                        auVar184 = vmovshdup_avx(auVar155);
                        bVar110 = 0;
                        if ((0.0 <= auVar184._0_4_) && (auVar184._0_4_ <= 1.0)) {
                          auVar188 = vrsqrtss_avx(auVar188,auVar188);
                          fVar241 = auVar188._0_4_;
                          pGVar11 = (context->scene->geometries).items[uVar99].ptr;
                          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar110 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar110 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0
                                  )) {
                            auVar188 = ZEXT416((uint)(fVar241 * 1.5 +
                                                     fVar169 * -0.5 * fVar241 * fVar241 * fVar241));
                            auVar188 = vshufps_avx(auVar188,auVar188,0);
                            auVar181._0_4_ = auVar188._0_4_ * local_920;
                            auVar181._4_4_ = auVar188._4_4_ * fStack_91c;
                            auVar181._8_4_ = auVar188._8_4_ * fStack_918;
                            auVar181._12_4_ = auVar188._12_4_ * fStack_914;
                            auVar117._0_4_ = auVar326._0_4_ + auVar112._0_4_ * auVar181._0_4_;
                            auVar117._4_4_ = auVar326._4_4_ + auVar112._4_4_ * auVar181._4_4_;
                            auVar117._8_4_ = auVar326._8_4_ + auVar112._8_4_ * auVar181._8_4_;
                            auVar117._12_4_ = auVar326._12_4_ + auVar112._12_4_ * auVar181._12_4_;
                            auVar188 = vshufps_avx(auVar181,auVar181,0xc9);
                            auVar184 = vshufps_avx(auVar326,auVar326,0xc9);
                            auVar182._0_4_ = auVar184._0_4_ * auVar181._0_4_;
                            auVar182._4_4_ = auVar184._4_4_ * auVar181._4_4_;
                            auVar182._8_4_ = auVar184._8_4_ * auVar181._8_4_;
                            auVar182._12_4_ = auVar184._12_4_ * auVar181._12_4_;
                            auVar212._0_4_ = auVar326._0_4_ * auVar188._0_4_;
                            auVar212._4_4_ = auVar326._4_4_ * auVar188._4_4_;
                            auVar212._8_4_ = auVar326._8_4_ * auVar188._8_4_;
                            auVar212._12_4_ = auVar326._12_4_ * auVar188._12_4_;
                            auVar354 = vsubps_avx(auVar212,auVar182);
                            auVar188 = vshufps_avx(auVar354,auVar354,0xc9);
                            auVar184 = vshufps_avx(auVar117,auVar117,0xc9);
                            auVar213._0_4_ = auVar184._0_4_ * auVar188._0_4_;
                            auVar213._4_4_ = auVar184._4_4_ * auVar188._4_4_;
                            auVar213._8_4_ = auVar184._8_4_ * auVar188._8_4_;
                            auVar213._12_4_ = auVar184._12_4_ * auVar188._12_4_;
                            auVar188 = vshufps_avx(auVar354,auVar354,0xd2);
                            auVar118._0_4_ = auVar117._0_4_ * auVar188._0_4_;
                            auVar118._4_4_ = auVar117._4_4_ * auVar188._4_4_;
                            auVar118._8_4_ = auVar117._8_4_ * auVar188._8_4_;
                            auVar118._12_4_ = auVar117._12_4_ * auVar188._12_4_;
                            auVar188 = vsubps_avx(auVar213,auVar118);
                            local_750 = vshufps_avx(auVar155,auVar155,0x55);
                            local_780 = (RTCHitN  [16])vshufps_avx(auVar188,auVar188,0x55);
                            auStack_770 = vshufps_avx(auVar188,auVar188,0xaa);
                            local_760 = vshufps_avx(auVar188,auVar188,0);
                            local_740 = ZEXT816(0) << 0x20;
                            local_730 = local_7a0._0_8_;
                            uStack_728 = local_7a0._8_8_;
                            local_720 = local_790._0_8_;
                            uStack_718 = local_790._8_8_;
                            uVar103 = context->user->instID[0];
                            _local_710 = CONCAT44(uVar103,uVar103);
                            _uStack_708 = CONCAT44(uVar103,uVar103);
                            uVar103 = context->user->instPrimID[0];
                            _uStack_700 = CONCAT44(uVar103,uVar103);
                            _uStack_6f8 = CONCAT44(uVar103,uVar103);
                            *(float *)(ray + k * 4 + 0x80) = fVar171;
                            auVar188 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                            local_8c0._0_16_ = auVar188;
                            local_a50.valid = (int *)local_8c0;
                            local_a50.geometryUserPtr = pGVar11->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_780;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar356 = ZEXT1664(auVar155);
                              auVar370 = ZEXT464((uint)fVar146);
                              auVar376 = ZEXT1664(auVar121);
                              (*pGVar11->occlusionFilterN)(&local_a50);
                              auVar274 = ZEXT3264(_local_980);
                              auVar188 = local_8c0._0_16_;
                            }
                            if (auVar188 == (undefined1  [16])0x0) {
                              auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar188 = auVar188 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var16 = context->args->filter;
                              if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar356 = ZEXT1664(auVar356._0_16_);
                                auVar370 = ZEXT1664(auVar370._0_16_);
                                auVar376 = ZEXT1664(auVar376._0_16_);
                                (*p_Var16)(&local_a50);
                                auVar274 = ZEXT3264(_local_980);
                                auVar188 = local_8c0._0_16_;
                              }
                              auVar184 = vpcmpeqd_avx(auVar188,_DAT_01f7aa10);
                              auVar188 = auVar184 ^ _DAT_01f7ae20;
                              auVar183._8_4_ = 0xff800000;
                              auVar183._0_8_ = 0xff800000ff800000;
                              auVar183._12_4_ = 0xff800000;
                              auVar184 = vblendvps_avx(auVar183,*(undefined1 (*) [16])
                                                                 (local_a50.ray + 0x80),auVar184);
                              *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar184;
                            }
                            auVar365 = ZEXT464((uint)fVar240);
                            auVar154._8_8_ = 0x100000001;
                            auVar154._0_8_ = 0x100000001;
                            bVar110 = (auVar154 & auVar188) != (undefined1  [16])0x0;
                            fVar205 = (float)local_a20._0_4_;
                            fVar224 = (float)local_a20._4_4_;
                            fVar225 = fStack_a18;
                            fVar226 = fStack_a14;
                            fVar227 = fStack_a10;
                            fVar238 = fStack_a0c;
                            fVar239 = fStack_a08;
                            if (!(bool)bVar110) {
                              *(float *)(ray + k * 4 + 0x80) = fVar240;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_00f39f69;
                  }
                }
                bVar109 = uVar101 < 4;
                uVar101 = uVar101 + 1;
              } while (uVar101 != 5);
              bVar109 = false;
              auVar274 = ZEXT3264(_local_980);
              bVar110 = 5;
LAB_00f39f69:
              bVar108 = (bool)(bVar108 | bVar109 & bVar110);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar131._4_4_ = uVar8;
              auVar131._0_4_ = uVar8;
              auVar131._8_4_ = uVar8;
              auVar131._12_4_ = uVar8;
              auVar131._16_4_ = uVar8;
              auVar131._20_4_ = uVar8;
              auVar131._24_4_ = uVar8;
              auVar131._28_4_ = uVar8;
              auVar128 = vcmpps_avx(_local_9a0,auVar131,2);
              fVar146 = auVar128._28_4_;
              auVar127 = vandps_avx(auVar128,local_5c0);
              auVar308 = ZEXT3264(auVar127);
              auVar128 = local_5c0 & auVar128;
              local_5c0 = auVar127;
            } while ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar128 >> 0x7f,0) != '\0') ||
                       (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar128 >> 0xbf,0) != '\0') ||
                     (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar128[0x1f] < '\0');
            auVar308 = ZEXT3264(local_380);
          }
          auVar166._0_4_ =
               fVar205 * (float)local_820._0_4_ +
               auVar274._0_4_ * (float)local_840._0_4_ +
               (float)local_800._0_4_ * (float)local_860._0_4_;
          auVar166._4_4_ =
               fVar224 * (float)local_820._4_4_ +
               auVar274._4_4_ * (float)local_840._4_4_ +
               (float)local_800._4_4_ * (float)local_860._4_4_;
          auVar166._8_4_ =
               fVar225 * fStack_818 + auVar274._8_4_ * fStack_838 + fStack_7f8 * fStack_858;
          auVar166._12_4_ =
               fVar226 * fStack_814 + auVar274._12_4_ * fStack_834 + fStack_7f4 * fStack_854;
          auVar166._16_4_ =
               fVar227 * fStack_810 + auVar274._16_4_ * fStack_830 + fStack_7f0 * fStack_850;
          auVar166._20_4_ =
               fVar238 * fStack_80c + auVar274._20_4_ * fStack_82c + fStack_7ec * fStack_84c;
          auVar166._24_4_ =
               fVar239 * fStack_808 + auVar274._24_4_ * fStack_828 + fStack_7e8 * fStack_848;
          auVar166._28_4_ = fVar146 + fVar146 + auVar308._28_4_;
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar197._16_4_ = 0x7fffffff;
          auVar197._20_4_ = 0x7fffffff;
          auVar197._24_4_ = 0x7fffffff;
          auVar197._28_4_ = 0x7fffffff;
          auVar127 = vandps_avx(auVar166,auVar197);
          auVar198._8_4_ = 0x3e99999a;
          auVar198._0_8_ = 0x3e99999a3e99999a;
          auVar198._12_4_ = 0x3e99999a;
          auVar198._16_4_ = 0x3e99999a;
          auVar198._20_4_ = 0x3e99999a;
          auVar198._24_4_ = 0x3e99999a;
          auVar198._28_4_ = 0x3e99999a;
          auVar127 = vcmpps_avx(auVar127,auVar198,1);
          auVar128 = vorps_avx(auVar127,local_640);
          auVar199._0_4_ = (float)local_8e0._0_4_ + (float)local_6c0._0_4_;
          auVar199._4_4_ = (float)local_8e0._4_4_ + (float)local_6c0._4_4_;
          auVar199._8_4_ = fStack_8d8 + fStack_6b8;
          auVar199._12_4_ = fStack_8d4 + fStack_6b4;
          auVar199._16_4_ = fStack_8d0 + fStack_6b0;
          auVar199._20_4_ = fStack_8cc + fStack_6ac;
          auVar199._24_4_ = fStack_8c8 + fStack_6a8;
          auVar199._28_4_ = fStack_8c4 + fStack_6a4;
          auVar127 = vcmpps_avx(auVar199,auVar131,2);
          _local_860 = vandps_avx(auVar127,local_620);
          auVar200._8_4_ = 3;
          auVar200._0_8_ = 0x300000003;
          auVar200._12_4_ = 3;
          auVar200._16_4_ = 3;
          auVar200._20_4_ = 3;
          auVar200._24_4_ = 3;
          auVar200._28_4_ = 3;
          auVar223._8_4_ = 2;
          auVar223._0_8_ = 0x200000002;
          auVar223._12_4_ = 2;
          auVar223._16_4_ = 2;
          auVar223._20_4_ = 2;
          auVar223._24_4_ = 2;
          auVar223._28_4_ = 2;
          auVar127 = vblendvps_avx(auVar223,auVar200,auVar128);
          auVar188 = vpcmpgtd_avx(auVar127._16_16_,local_680);
          auVar184 = vpshufd_avx(local_660._0_16_,0);
          auVar184 = vpcmpgtd_avx(auVar127._0_16_,auVar184);
          auVar201._16_16_ = auVar188;
          auVar201._0_16_ = auVar131._0_16_;
          _local_840 = vblendps_avx(ZEXT1632(auVar184),auVar201,0xf0);
          auVar127 = vandnps_avx(_local_840,_local_860);
          auVar128 = _local_860 & ~_local_840;
          local_8c0 = auVar127;
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            local_820._4_4_ = (float)local_8e0._4_4_ + local_380._4_4_;
            local_820._0_4_ = (float)local_8e0._0_4_ + local_380._0_4_;
            fStack_818 = fStack_8d8 + local_380._8_4_;
            fStack_814 = fStack_8d4 + local_380._12_4_;
            fStack_810 = fStack_8d0 + local_380._16_4_;
            fStack_80c = fStack_8cc + local_380._20_4_;
            fStack_808 = fStack_8c8 + local_380._24_4_;
            fStack_804 = fStack_8c4 + local_380._28_4_;
            _local_9a0 = local_380;
            do {
              auVar133._8_4_ = 0x7f800000;
              auVar133._0_8_ = 0x7f8000007f800000;
              auVar133._12_4_ = 0x7f800000;
              auVar133._16_4_ = 0x7f800000;
              auVar133._20_4_ = 0x7f800000;
              auVar133._24_4_ = 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar128 = vblendvps_avx(auVar133,_local_9a0,auVar127);
              auVar42 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar42 = vminps_avx(auVar128,auVar42);
              auVar39 = vshufpd_avx(auVar42,auVar42,5);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar39 = vperm2f128_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar42,auVar39);
              auVar42 = vcmpps_avx(auVar128,auVar42,0);
              auVar39 = auVar127 & auVar42;
              auVar128 = auVar127;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar128 = vandps_avx(auVar42,auVar127);
              }
              uVar100 = vmovmskps_avx(auVar128);
              uVar103 = 0;
              if (uVar100 != 0) {
                for (; (uVar100 >> uVar103 & 1) == 0; uVar103 = uVar103 + 1) {
                }
              }
              uVar101 = (ulong)uVar103;
              local_8c0 = auVar127;
              *(undefined4 *)(local_8c0 + uVar101 * 4) = 0;
              fVar146 = local_1c0[uVar101];
              uVar103 = *(uint *)(local_360 + uVar101 * 4);
              fVar169 = auVar18._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar169 = sqrtf((float)local_9c0._0_4_);
              }
              auVar184 = vminps_avx(auVar35,auVar37);
              auVar188 = vmaxps_avx(auVar35,auVar37);
              auVar121 = vminps_avx(auVar36,auVar38);
              auVar155 = vminps_avx(auVar184,auVar121);
              auVar184 = vmaxps_avx(auVar36,auVar38);
              auVar121 = vmaxps_avx(auVar188,auVar184);
              auVar214._8_4_ = 0x7fffffff;
              auVar214._0_8_ = 0x7fffffff7fffffff;
              auVar214._12_4_ = 0x7fffffff;
              auVar188 = vandps_avx(auVar155,auVar214);
              auVar184 = vandps_avx(auVar121,auVar214);
              auVar188 = vmaxps_avx(auVar188,auVar184);
              auVar184 = vmovshdup_avx(auVar188);
              auVar184 = vmaxss_avx(auVar184,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar184);
              fVar171 = auVar188._0_4_ * 1.9073486e-06;
              local_900._0_4_ = fVar169 * 1.9073486e-06;
              local_960._0_16_ = vshufps_avx(auVar121,auVar121,0xff);
              auVar188 = vinsertps_avx(ZEXT416(uVar103),ZEXT416((uint)fVar146),0x10);
              auVar356 = ZEXT1664(auVar188);
              bVar109 = true;
              uVar101 = 0;
              do {
                auVar354 = auVar356._0_16_;
                auVar188 = vmovshdup_avx(auVar354);
                fVar146 = auVar188._0_4_;
                fVar225 = 1.0 - fVar146;
                fVar169 = fVar225 * fVar225 * fVar225;
                fVar205 = fVar146 * fVar146 * fVar146;
                fVar224 = fVar146 * fVar225;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar205 * 0.16666667)),
                                       ZEXT416((uint)(fVar205 * 0.16666667)),0);
                auVar184 = ZEXT416((uint)((fVar205 * 4.0 + fVar169 +
                                          fVar146 * fVar224 * 12.0 + fVar225 * fVar224 * 6.0) *
                                         0.16666667));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar121 = ZEXT416((uint)((fVar169 * 4.0 + fVar205 +
                                          fVar225 * fVar224 * 12.0 + fVar146 * fVar224 * 6.0) *
                                         0.16666667));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar155 = vshufps_avx(auVar354,auVar354,0);
                auVar185._0_4_ = auVar155._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar185._4_4_ = auVar155._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar185._8_4_ = auVar155._8_4_ * fStack_9a8 + 0.0;
                auVar185._12_4_ = auVar155._12_4_ * fStack_9a4 + 0.0;
                auVar155 = vshufps_avx(ZEXT416((uint)(fVar169 * 0.16666667)),
                                       ZEXT416((uint)(fVar169 * 0.16666667)),0);
                auVar119._0_4_ =
                     auVar155._0_4_ * local_a90 +
                     auVar121._0_4_ * local_ab0 +
                     auVar188._0_4_ * local_ac0 + auVar184._0_4_ * local_aa0;
                auVar119._4_4_ =
                     auVar155._4_4_ * fStack_a8c +
                     auVar121._4_4_ * fStack_aac +
                     auVar188._4_4_ * fStack_abc + auVar184._4_4_ * fStack_a9c;
                auVar119._8_4_ =
                     auVar155._8_4_ * fStack_a88 +
                     auVar121._8_4_ * fStack_aa8 +
                     auVar188._8_4_ * fStack_ab8 + auVar184._8_4_ * fStack_a98;
                auVar119._12_4_ =
                     auVar155._12_4_ * fStack_a84 +
                     auVar121._12_4_ * fStack_aa4 +
                     auVar188._12_4_ * fStack_ab4 + auVar184._12_4_ * fStack_a94;
                local_940._0_16_ = auVar119;
                auVar188 = vsubps_avx(auVar185,auVar119);
                local_920 = auVar188._0_4_;
                fStack_91c = auVar188._4_4_;
                fStack_918 = auVar188._8_4_;
                fStack_914 = auVar188._12_4_;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                fVar169 = auVar188._0_4_;
                local_ba0 = auVar356._0_4_;
                if (fVar169 < 0.0) {
                  fVar205 = sqrtf(fVar169);
                }
                else {
                  auVar184 = vsqrtss_avx(auVar188,auVar188);
                  fVar205 = auVar184._0_4_;
                }
                auVar184 = ZEXT416((uint)(fVar146 * fVar146 * 0.5));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar121 = ZEXT416((uint)((fVar225 * fVar225 + fVar224 * 4.0) * 0.5));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar155 = ZEXT416((uint)((fVar146 * -fVar146 - fVar224 * 4.0) * 0.5));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar120 = ZEXT416((uint)(fVar225 * -fVar225 * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar327._0_4_ =
                     local_a90 * auVar120._0_4_ +
                     local_ab0 * auVar155._0_4_ +
                     local_ac0 * auVar184._0_4_ + local_aa0 * auVar121._0_4_;
                auVar327._4_4_ =
                     fStack_a8c * auVar120._4_4_ +
                     fStack_aac * auVar155._4_4_ +
                     fStack_abc * auVar184._4_4_ + fStack_a9c * auVar121._4_4_;
                auVar327._8_4_ =
                     fStack_a88 * auVar120._8_4_ +
                     fStack_aa8 * auVar155._8_4_ +
                     fStack_ab8 * auVar184._8_4_ + fStack_a98 * auVar121._8_4_;
                auVar327._12_4_ =
                     fStack_a84 * auVar120._12_4_ +
                     fStack_aa4 * auVar155._12_4_ +
                     fStack_ab4 * auVar184._12_4_ + fStack_a94 * auVar121._12_4_;
                auVar184 = vshufps_avx(auVar354,auVar354,0x55);
                auVar121 = ZEXT416((uint)(fVar225 - (fVar146 + fVar146)));
                auVar155 = vshufps_avx(auVar121,auVar121,0);
                auVar121 = ZEXT416((uint)(fVar146 - (fVar225 + fVar225)));
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar111 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
                auVar121 = vdpps_avx(auVar327,auVar327,0x7f);
                auVar156._0_4_ =
                     local_a90 * auVar111._0_4_ +
                     local_ab0 * auVar120._0_4_ +
                     local_ac0 * auVar184._0_4_ + local_aa0 * auVar155._0_4_;
                auVar156._4_4_ =
                     fStack_a8c * auVar111._4_4_ +
                     fStack_aac * auVar120._4_4_ +
                     fStack_abc * auVar184._4_4_ + fStack_a9c * auVar155._4_4_;
                auVar156._8_4_ =
                     fStack_a88 * auVar111._8_4_ +
                     fStack_aa8 * auVar120._8_4_ +
                     fStack_ab8 * auVar184._8_4_ + fStack_a98 * auVar155._8_4_;
                auVar156._12_4_ =
                     fStack_a84 * auVar111._12_4_ +
                     fStack_aa4 * auVar120._12_4_ +
                     fStack_ab4 * auVar184._12_4_ + fStack_a94 * auVar155._12_4_;
                auVar184 = vblendps_avx(auVar121,_DAT_01f7aa10,0xe);
                auVar155 = vrsqrtss_avx(auVar184,auVar184);
                fVar224 = auVar155._0_4_;
                fVar146 = auVar121._0_4_;
                auVar155 = vdpps_avx(auVar327,auVar156,0x7f);
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar157._0_4_ = auVar156._0_4_ * auVar120._0_4_;
                auVar157._4_4_ = auVar156._4_4_ * auVar120._4_4_;
                auVar157._8_4_ = auVar156._8_4_ * auVar120._8_4_;
                auVar157._12_4_ = auVar156._12_4_ * auVar120._12_4_;
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar233._0_4_ = auVar327._0_4_ * auVar155._0_4_;
                auVar233._4_4_ = auVar327._4_4_ * auVar155._4_4_;
                auVar233._8_4_ = auVar327._8_4_ * auVar155._8_4_;
                auVar233._12_4_ = auVar327._12_4_ * auVar155._12_4_;
                auVar111 = vsubps_avx(auVar157,auVar233);
                auVar155 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)fVar171),
                                      ZEXT416((uint)(local_ba0 * (float)local_900._0_4_)));
                auVar365 = ZEXT1664(auVar184);
                auVar155 = ZEXT416((uint)(auVar155._0_4_ * (2.0 - fVar146 * auVar155._0_4_)));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                uVar91 = CONCAT44(auVar327._4_4_,auVar327._0_4_);
                auVar246._0_8_ = uVar91 ^ 0x8000000080000000;
                auVar246._8_4_ = -auVar327._8_4_;
                auVar246._12_4_ = -auVar327._12_4_;
                auVar120 = ZEXT416((uint)(fVar224 * 1.5 +
                                         fVar146 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar215._0_4_ = auVar120._0_4_ * auVar111._0_4_ * auVar155._0_4_;
                auVar215._4_4_ = auVar120._4_4_ * auVar111._4_4_ * auVar155._4_4_;
                auVar215._8_4_ = auVar120._8_4_ * auVar111._8_4_ * auVar155._8_4_;
                auVar215._12_4_ = auVar120._12_4_ * auVar111._12_4_ * auVar155._12_4_;
                auVar266._0_4_ = auVar327._0_4_ * auVar120._0_4_;
                auVar266._4_4_ = auVar327._4_4_ * auVar120._4_4_;
                auVar266._8_4_ = auVar327._8_4_ * auVar120._8_4_;
                auVar266._12_4_ = auVar327._12_4_ * auVar120._12_4_;
                if (fVar146 < 0.0) {
                  local_9e0._0_16_ = auVar215;
                  fVar146 = sqrtf(fVar146);
                  auVar365 = ZEXT464(auVar184._0_4_);
                  auVar215 = local_9e0._0_16_;
                }
                else {
                  auVar121 = vsqrtss_avx(auVar121,auVar121);
                  fVar146 = auVar121._0_4_;
                }
                auVar95._4_4_ = fStack_91c;
                auVar95._0_4_ = local_920;
                auVar95._8_4_ = fStack_918;
                auVar95._12_4_ = fStack_914;
                auVar121 = vdpps_avx(auVar95,auVar266,0x7f);
                fVar146 = (fVar171 / fVar146) * (fVar205 + 1.0) + auVar365._0_4_ + fVar205 * fVar171
                ;
                auVar155 = vdpps_avx(auVar246,auVar266,0x7f);
                auVar120 = vdpps_avx(auVar95,auVar215,0x7f);
                auVar111 = vdpps_avx(_local_9b0,auVar266,0x7f);
                auVar112 = vdpps_avx(auVar95,auVar246,0x7f);
                fVar205 = auVar155._0_4_ + auVar120._0_4_;
                fVar224 = auVar121._0_4_;
                auVar122._0_4_ = fVar224 * fVar224;
                auVar122._4_4_ = auVar121._4_4_ * auVar121._4_4_;
                auVar122._8_4_ = auVar121._8_4_ * auVar121._8_4_;
                auVar122._12_4_ = auVar121._12_4_ * auVar121._12_4_;
                auVar120 = vsubps_avx(auVar188,auVar122);
                auVar155 = vdpps_avx(auVar95,_local_9b0,0x7f);
                fVar225 = auVar112._0_4_ - fVar224 * fVar205;
                fVar226 = auVar155._0_4_ - fVar224 * auVar111._0_4_;
                auVar155 = vrsqrtss_avx(auVar120,auVar120);
                fVar227 = auVar120._0_4_;
                fVar224 = auVar155._0_4_;
                fVar224 = fVar224 * 1.5 + fVar227 * -0.5 * fVar224 * fVar224 * fVar224;
                if (fVar227 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar205);
                  local_7c0._0_4_ = fVar225;
                  local_7e0._0_4_ = fVar226;
                  local_a00._0_4_ = fVar224;
                  fVar227 = sqrtf(fVar227);
                  auVar365 = ZEXT464(auVar184._0_4_);
                  fVar224 = (float)local_a00._0_4_;
                  fVar225 = (float)local_7c0._0_4_;
                  fVar226 = (float)local_7e0._0_4_;
                  auVar184 = local_9e0._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar120,auVar120);
                  fVar227 = auVar184._0_4_;
                  auVar184 = ZEXT416((uint)fVar205);
                }
                auVar376 = ZEXT1664(auVar121);
                auVar370 = ZEXT464((uint)fVar146);
                auVar113 = vpermilps_avx(local_940._0_16_,0xff);
                auVar112 = vshufps_avx(auVar327,auVar327,0xff);
                fVar225 = fVar225 * fVar224 - auVar112._0_4_;
                auVar234._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar234._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar247._0_4_ = -fVar225;
                auVar247._4_4_ = 0x80000000;
                auVar247._8_4_ = 0x80000000;
                auVar247._12_4_ = 0x80000000;
                fVar205 = auVar184._0_4_ * fVar226 * fVar224;
                auVar274 = ZEXT464((uint)fVar205);
                auVar155 = vinsertps_avx(auVar247,ZEXT416((uint)(fVar226 * fVar224)),0x1c);
                auVar120 = vmovsldup_avx(ZEXT416((uint)(fVar205 - auVar111._0_4_ * fVar225)));
                auVar155 = vdivps_avx(auVar155,auVar120);
                auVar184 = vinsertps_avx(auVar184,auVar234,0x10);
                auVar184 = vdivps_avx(auVar184,auVar120);
                auVar120 = vmovsldup_avx(auVar121);
                auVar113 = ZEXT416((uint)(fVar227 - auVar113._0_4_));
                auVar111 = vmovsldup_avx(auVar113);
                auVar186._0_4_ = auVar120._0_4_ * auVar155._0_4_ + auVar111._0_4_ * auVar184._0_4_;
                auVar186._4_4_ = auVar120._4_4_ * auVar155._4_4_ + auVar111._4_4_ * auVar184._4_4_;
                auVar186._8_4_ = auVar120._8_4_ * auVar155._8_4_ + auVar111._8_4_ * auVar184._8_4_;
                auVar186._12_4_ =
                     auVar120._12_4_ * auVar155._12_4_ + auVar111._12_4_ * auVar184._12_4_;
                auVar155 = vsubps_avx(auVar354,auVar186);
                auVar356 = ZEXT1664(auVar155);
                auVar187._8_4_ = 0x7fffffff;
                auVar187._0_8_ = 0x7fffffff7fffffff;
                auVar187._12_4_ = 0x7fffffff;
                auVar184 = vandps_avx(auVar121,auVar187);
                if (auVar184._0_4_ < fVar146) {
                  auVar216._8_4_ = 0x7fffffff;
                  auVar216._0_8_ = 0x7fffffff7fffffff;
                  auVar216._12_4_ = 0x7fffffff;
                  auVar184 = vandps_avx(auVar113,auVar216);
                  if (auVar184._0_4_ <
                      (float)local_960._0_4_ * 1.9073486e-06 + auVar365._0_4_ + fVar146) {
                    fVar171 = auVar155._0_4_ + (float)local_890._0_4_;
                    if (fVar144 <= fVar171) {
                      fVar224 = *(float *)(ray + k * 4 + 0x80);
                      auVar365 = ZEXT464((uint)fVar224);
                      if (fVar224 < fVar171) {
                        bVar110 = 0;
                        goto LAB_00f3a7f3;
                      }
                      auVar184 = vmovshdup_avx(auVar155);
                      bVar110 = 0;
                      if ((auVar184._0_4_ < 0.0) || (1.0 < auVar184._0_4_)) goto LAB_00f3a7f3;
                      auVar188 = vrsqrtss_avx(auVar188,auVar188);
                      fVar225 = auVar188._0_4_;
                      pGVar11 = (context->scene->geometries).items[uVar99].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (bVar110 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar188 = ZEXT416((uint)(fVar225 * 1.5 +
                                                   fVar169 * -0.5 * fVar225 * fVar225 * fVar225));
                          auVar188 = vshufps_avx(auVar188,auVar188,0);
                          auVar189._0_4_ = auVar188._0_4_ * local_920;
                          auVar189._4_4_ = auVar188._4_4_ * fStack_91c;
                          auVar189._8_4_ = auVar188._8_4_ * fStack_918;
                          auVar189._12_4_ = auVar188._12_4_ * fStack_914;
                          auVar123._0_4_ = auVar327._0_4_ + auVar112._0_4_ * auVar189._0_4_;
                          auVar123._4_4_ = auVar327._4_4_ + auVar112._4_4_ * auVar189._4_4_;
                          auVar123._8_4_ = auVar327._8_4_ + auVar112._8_4_ * auVar189._8_4_;
                          auVar123._12_4_ = auVar327._12_4_ + auVar112._12_4_ * auVar189._12_4_;
                          auVar188 = vshufps_avx(auVar189,auVar189,0xc9);
                          auVar184 = vshufps_avx(auVar327,auVar327,0xc9);
                          auVar190._0_4_ = auVar184._0_4_ * auVar189._0_4_;
                          auVar190._4_4_ = auVar184._4_4_ * auVar189._4_4_;
                          auVar190._8_4_ = auVar184._8_4_ * auVar189._8_4_;
                          auVar190._12_4_ = auVar184._12_4_ * auVar189._12_4_;
                          auVar217._0_4_ = auVar327._0_4_ * auVar188._0_4_;
                          auVar217._4_4_ = auVar327._4_4_ * auVar188._4_4_;
                          auVar217._8_4_ = auVar327._8_4_ * auVar188._8_4_;
                          auVar217._12_4_ = auVar327._12_4_ * auVar188._12_4_;
                          auVar354 = vsubps_avx(auVar217,auVar190);
                          auVar188 = vshufps_avx(auVar354,auVar354,0xc9);
                          auVar184 = vshufps_avx(auVar123,auVar123,0xc9);
                          auVar218._0_4_ = auVar184._0_4_ * auVar188._0_4_;
                          auVar218._4_4_ = auVar184._4_4_ * auVar188._4_4_;
                          auVar218._8_4_ = auVar184._8_4_ * auVar188._8_4_;
                          auVar218._12_4_ = auVar184._12_4_ * auVar188._12_4_;
                          auVar188 = vshufps_avx(auVar354,auVar354,0xd2);
                          auVar124._0_4_ = auVar123._0_4_ * auVar188._0_4_;
                          auVar124._4_4_ = auVar123._4_4_ * auVar188._4_4_;
                          auVar124._8_4_ = auVar123._8_4_ * auVar188._8_4_;
                          auVar124._12_4_ = auVar123._12_4_ * auVar188._12_4_;
                          auVar188 = vsubps_avx(auVar218,auVar124);
                          local_750 = vshufps_avx(auVar155,auVar155,0x55);
                          local_780 = (RTCHitN  [16])vshufps_avx(auVar188,auVar188,0x55);
                          auStack_770 = vshufps_avx(auVar188,auVar188,0xaa);
                          local_760 = vshufps_avx(auVar188,auVar188,0);
                          local_740 = ZEXT816(0) << 0x20;
                          local_730 = local_7a0._0_8_;
                          uStack_728 = local_7a0._8_8_;
                          local_720 = local_790._0_8_;
                          uStack_718 = local_790._8_8_;
                          uVar103 = context->user->instID[0];
                          _local_710 = CONCAT44(uVar103,uVar103);
                          _uStack_708 = CONCAT44(uVar103,uVar103);
                          uVar103 = context->user->instPrimID[0];
                          _uStack_700 = CONCAT44(uVar103,uVar103);
                          _uStack_6f8 = CONCAT44(uVar103,uVar103);
                          *(float *)(ray + k * 4 + 0x80) = fVar171;
                          local_880 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                          local_a50.valid = (int *)local_880;
                          local_a50.geometryUserPtr = pGVar11->userPtr;
                          local_a50.context = context->user;
                          local_a50.hit = local_780;
                          local_a50.N = 4;
                          local_a50.ray = (RTCRayN *)ray;
                          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar274 = ZEXT464((uint)fVar205);
                            auVar356 = ZEXT1664(auVar155);
                            auVar370 = ZEXT464((uint)fVar146);
                            auVar376 = ZEXT1664(auVar121);
                            (*pGVar11->occlusionFilterN)(&local_a50);
                          }
                          if (local_880 == (undefined1  [16])0x0) {
                            auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar188 = auVar188 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var16 = context->args->filter;
                            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar274 = ZEXT1664(auVar274._0_16_);
                              auVar356 = ZEXT1664(auVar356._0_16_);
                              auVar370 = ZEXT1664(auVar370._0_16_);
                              auVar376 = ZEXT1664(auVar376._0_16_);
                              (*p_Var16)(&local_a50);
                            }
                            auVar184 = vpcmpeqd_avx(local_880,_DAT_01f7aa10);
                            auVar188 = auVar184 ^ _DAT_01f7ae20;
                            auVar191._8_4_ = 0xff800000;
                            auVar191._0_8_ = 0xff800000ff800000;
                            auVar191._12_4_ = 0xff800000;
                            auVar184 = vblendvps_avx(auVar191,*(undefined1 (*) [16])
                                                               (local_a50.ray + 0x80),auVar184);
                            *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar184;
                          }
                          auVar365 = ZEXT464((uint)fVar224);
                          auVar158._8_8_ = 0x100000001;
                          auVar158._0_8_ = 0x100000001;
                          bVar110 = (auVar158 & auVar188) != (undefined1  [16])0x0;
                          if (!(bool)bVar110) {
                            *(float *)(ray + k * 4 + 0x80) = fVar224;
                          }
                        }
                        goto LAB_00f3a7f3;
                      }
                    }
                    bVar110 = 0;
                    goto LAB_00f3a7f3;
                  }
                }
                bVar109 = uVar101 < 4;
                uVar101 = uVar101 + 1;
              } while (uVar101 != 5);
              bVar109 = false;
              bVar110 = 5;
LAB_00f3a7f3:
              bVar108 = (bool)(bVar108 | bVar109 & bVar110);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar131._4_4_ = uVar8;
              auVar131._0_4_ = uVar8;
              auVar131._8_4_ = uVar8;
              auVar131._12_4_ = uVar8;
              auVar131._16_4_ = uVar8;
              auVar131._20_4_ = uVar8;
              auVar131._24_4_ = uVar8;
              auVar131._28_4_ = uVar8;
              auVar128 = vcmpps_avx(_local_820,auVar131,2);
              auVar127 = vandps_avx(auVar128,local_8c0);
              auVar128 = local_8c0 & auVar128;
              local_8c0 = auVar127;
            } while ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar128 >> 0x7f,0) != '\0') ||
                       (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar128 >> 0xbf,0) != '\0') ||
                     (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar128[0x1f] < '\0');
          }
          auVar127 = vandps_avx(local_600,local_5e0);
          auVar128 = vandps_avx(_local_860,_local_840);
          auVar308 = ZEXT3264(_local_8e0);
          auVar236._0_4_ = local_8e0._0_4_ + local_3c0._0_4_;
          auVar236._4_4_ = local_8e0._4_4_ + local_3c0._4_4_;
          auVar236._8_4_ = local_8e0._8_4_ + local_3c0._8_4_;
          auVar236._12_4_ = local_8e0._12_4_ + local_3c0._12_4_;
          auVar236._16_4_ = local_8e0._16_4_ + local_3c0._16_4_;
          auVar236._20_4_ = local_8e0._20_4_ + local_3c0._20_4_;
          auVar236._24_4_ = local_8e0._24_4_ + local_3c0._24_4_;
          auVar236._28_4_ = local_8e0._28_4_ + local_3c0._28_4_;
          auVar42 = vcmpps_avx(auVar236,auVar131,2);
          auVar127 = vandps_avx(auVar42,auVar127);
          auVar237._0_4_ = local_380._0_4_ + local_8e0._0_4_;
          auVar237._4_4_ = local_380._4_4_ + local_8e0._4_4_;
          auVar237._8_4_ = local_380._8_4_ + local_8e0._8_4_;
          auVar237._12_4_ = local_380._12_4_ + local_8e0._12_4_;
          auVar237._16_4_ = local_380._16_4_ + local_8e0._16_4_;
          auVar237._20_4_ = local_380._20_4_ + local_8e0._20_4_;
          auVar237._24_4_ = local_380._24_4_ + local_8e0._24_4_;
          auVar237._28_4_ = local_380._28_4_ + local_8e0._28_4_;
          auVar42 = vcmpps_avx(auVar237,auVar131,2);
          auVar128 = vandps_avx(auVar42,auVar128);
          auVar128 = vorps_avx(auVar127,auVar128);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar106 * 0x60) = auVar128;
            auVar127 = vblendvps_avx(local_380,_local_3c0,auVar127);
            *(undefined1 (*) [32])(auStack_160 + uVar106 * 0x60) = auVar127;
            uVar9 = vmovlps_avx(local_590);
            (&uStack_140)[uVar106 * 0xc] = uVar9;
            aiStack_138[uVar106 * 0x18] = local_bc8 + 1;
            iVar105 = iVar105 + 1;
          }
        }
      }
    }
    if (iVar105 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar134._4_4_ = uVar8;
    auVar134._0_4_ = uVar8;
    auVar134._8_4_ = uVar8;
    auVar134._12_4_ = uVar8;
    auVar134._16_4_ = uVar8;
    auVar134._20_4_ = uVar8;
    auVar134._24_4_ = uVar8;
    auVar134._28_4_ = uVar8;
    uVar103 = -iVar105;
    pauVar102 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar105 - 1) * 0x60);
    while( true ) {
      auVar127 = pauVar102[1];
      auVar167._0_4_ = (float)local_8e0._0_4_ + auVar127._0_4_;
      auVar167._4_4_ = (float)local_8e0._4_4_ + auVar127._4_4_;
      auVar167._8_4_ = fStack_8d8 + auVar127._8_4_;
      auVar167._12_4_ = fStack_8d4 + auVar127._12_4_;
      auVar167._16_4_ = fStack_8d0 + auVar127._16_4_;
      auVar167._20_4_ = fStack_8cc + auVar127._20_4_;
      auVar167._24_4_ = fStack_8c8 + auVar127._24_4_;
      auVar167._28_4_ = fStack_8c4 + auVar127._28_4_;
      auVar128 = vcmpps_avx(auVar167,auVar134,2);
      _local_780 = vandps_avx(auVar128,*pauVar102);
      auVar128 = *pauVar102 & auVar128;
      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0x7f,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0xbf,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar128[0x1f] < '\0') break;
      pauVar102 = pauVar102 + -3;
      uVar103 = uVar103 + 1;
      if (uVar103 == 0) goto LAB_00f3adfc;
    }
    auVar135._8_4_ = 0x7f800000;
    auVar135._0_8_ = 0x7f8000007f800000;
    auVar135._12_4_ = 0x7f800000;
    auVar135._16_4_ = 0x7f800000;
    auVar135._20_4_ = 0x7f800000;
    auVar135._24_4_ = 0x7f800000;
    auVar135._28_4_ = 0x7f800000;
    auVar127 = vblendvps_avx(auVar135,auVar127,_local_780);
    auVar128 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar128 = vminps_avx(auVar127,auVar128);
    auVar42 = vshufpd_avx(auVar128,auVar128,5);
    auVar128 = vminps_avx(auVar128,auVar42);
    auVar42 = vperm2f128_avx(auVar128,auVar128,1);
    auVar128 = vminps_avx(auVar128,auVar42);
    auVar128 = vcmpps_avx(auVar127,auVar128,0);
    auVar42 = _local_780 & auVar128;
    auVar127 = _local_780;
    if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0x7f,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar42 >> 0xbf,0) != '\0') ||
        (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar42[0x1f] < '\0')
    {
      auVar127 = vandps_avx(auVar128,_local_780);
    }
    auVar125._8_8_ = 0;
    auVar125._0_8_ = *(ulong *)pauVar102[2];
    local_bc8 = *(uint *)(pauVar102[2] + 8);
    uVar104 = vmovmskps_avx(auVar127);
    uVar100 = 0;
    if (uVar104 != 0) {
      for (; (uVar104 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
      }
    }
    *(undefined4 *)(local_780 + (ulong)uVar100 * 4) = 0;
    *pauVar102 = _local_780;
    uVar104 = ~uVar103;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar104 = -uVar103;
    }
    uVar106 = (ulong)uVar104;
    auVar188 = vshufps_avx(auVar125,auVar125,0);
    auVar184 = vshufps_avx(auVar125,auVar125,0x55);
    auVar184 = vsubps_avx(auVar184,auVar188);
    local_3c0._4_4_ = auVar188._4_4_ + auVar184._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar188._0_4_ + auVar184._0_4_ * 0.0;
    fStack_3b8 = auVar188._8_4_ + auVar184._8_4_ * 0.2857143;
    fStack_3b4 = auVar188._12_4_ + auVar184._12_4_ * 0.42857146;
    fStack_3b0 = auVar188._0_4_ + auVar184._0_4_ * 0.5714286;
    fStack_3ac = auVar188._4_4_ + auVar184._4_4_ * 0.71428573;
    fStack_3a8 = auVar188._8_4_ + auVar184._8_4_ * 0.8571429;
    fStack_3a4 = auVar188._12_4_ + auVar184._12_4_;
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar100 * 4);
  } while( true );
LAB_00f3adfc:
  if (bVar108 != false) {
    return bVar108;
  }
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar126._4_4_ = uVar8;
  auVar126._0_4_ = uVar8;
  auVar126._8_4_ = uVar8;
  auVar126._12_4_ = uVar8;
  auVar151 = vcmpps_avx(local_5a0,auVar126,2);
  uVar99 = vmovmskps_avx(auVar151);
  uVar99 = (uint)local_868 - 1 & (uint)local_868 & uVar99;
  if (uVar99 == 0) {
    return false;
  }
  goto LAB_00f38277;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }